

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  uint uVar50;
  ulong uVar51;
  long lVar52;
  byte bVar53;
  uint uVar54;
  uint uVar55;
  bool bVar56;
  ulong uVar57;
  ulong uVar58;
  float fVar59;
  float fVar60;
  undefined4 uVar61;
  float fVar62;
  float fVar91;
  vint4 bi_2;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar92;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined8 uVar93;
  vint4 bi_1;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar117;
  vint4 ai_2;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  vint4 ai;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  float fVar139;
  float fVar140;
  float fVar157;
  float fVar158;
  vint4 bi;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar159;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  float fVar173;
  float fVar186;
  float fVar187;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar188;
  undefined1 auVar185 [32];
  vint4 ai_1;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar210;
  vfloat4 a0_3;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  vfloat4 a0_1;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  vfloat4 a0;
  undefined1 auVar232 [16];
  undefined1 auVar231 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar239;
  float fVar247;
  float fVar248;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar249;
  undefined1 auVar246 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar262 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_51c;
  undefined1 local_518 [8];
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_500;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  ulong local_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [32];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  uint local_408;
  uint uStack_404;
  uint uStack_400;
  uint uStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  ulong local_370;
  undefined1 local_368 [32];
  RTCFilterFunctionNArguments local_348;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 auStack_2e8 [16];
  uint auStack_2d8 [4];
  undefined8 local_2c8;
  undefined4 local_2c0;
  undefined8 local_2bc;
  undefined4 local_2b4;
  undefined4 local_2b0;
  uint local_2ac;
  uint local_2a8;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  uint uStack_178;
  float afStack_174 [7];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar261 [32];
  
  PVar3 = prim[1];
  uVar58 = (ulong)(byte)PVar3;
  fVar59 = *(float *)(prim + uVar58 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar58 * 0x19 + 6));
  auVar63._0_4_ = fVar59 * auVar12._0_4_;
  auVar63._4_4_ = fVar59 * auVar12._4_4_;
  auVar63._8_4_ = fVar59 * auVar12._8_4_;
  auVar63._12_4_ = fVar59 * auVar12._12_4_;
  auVar141._0_4_ = fVar59 * (ray->dir).field_0.m128[0];
  auVar141._4_4_ = fVar59 * (ray->dir).field_0.m128[1];
  auVar141._8_4_ = fVar59 * (ray->dir).field_0.m128[2];
  auVar141._12_4_ = fVar59 * (ray->dir).field_0.m128[3];
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar258 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 6 + 6)));
  auVar258 = vcvtdq2ps_avx(auVar258);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar58 + 6)));
  auVar232 = vcvtdq2ps_avx(auVar232);
  uVar51 = (ulong)(uint)((int)(uVar58 * 9) * 2);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 + uVar58 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  uVar51 = (ulong)(uint)((int)(uVar58 * 5) << 2);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar250._4_4_ = auVar141._0_4_;
  auVar250._0_4_ = auVar141._0_4_;
  auVar250._8_4_ = auVar141._0_4_;
  auVar250._12_4_ = auVar141._0_4_;
  auVar226 = vshufps_avx(auVar141,auVar141,0x55);
  auVar64 = vshufps_avx(auVar141,auVar141,0xaa);
  fVar59 = auVar64._0_4_;
  auVar223._0_4_ = fVar59 * auVar258._0_4_;
  fVar91 = auVar64._4_4_;
  auVar223._4_4_ = fVar91 * auVar258._4_4_;
  fVar117 = auVar64._8_4_;
  auVar223._8_4_ = fVar117 * auVar258._8_4_;
  fVar92 = auVar64._12_4_;
  auVar223._12_4_ = fVar92 * auVar258._12_4_;
  auVar211._0_4_ = auVar232._0_4_ * fVar59;
  auVar211._4_4_ = auVar232._4_4_ * fVar91;
  auVar211._8_4_ = auVar232._8_4_ * fVar117;
  auVar211._12_4_ = auVar232._12_4_ * fVar92;
  auVar189._0_4_ = auVar107._0_4_ * fVar59;
  auVar189._4_4_ = auVar107._4_4_ * fVar91;
  auVar189._8_4_ = auVar107._8_4_ * fVar117;
  auVar189._12_4_ = auVar107._12_4_ * fVar92;
  auVar64 = vfmadd231ps_fma(auVar223,auVar226,auVar9);
  auVar95 = vfmadd231ps_fma(auVar211,auVar226,auVar11);
  auVar226 = vfmadd231ps_fma(auVar189,auVar65,auVar226);
  auVar120 = vfmadd231ps_fma(auVar64,auVar250,auVar12);
  auVar95 = vfmadd231ps_fma(auVar95,auVar250,auVar10);
  auVar129 = vfmadd231ps_fma(auVar226,auVar66,auVar250);
  auVar251._4_4_ = auVar63._0_4_;
  auVar251._0_4_ = auVar63._0_4_;
  auVar251._8_4_ = auVar63._0_4_;
  auVar251._12_4_ = auVar63._0_4_;
  auVar226 = vshufps_avx(auVar63,auVar63,0x55);
  auVar64 = vshufps_avx(auVar63,auVar63,0xaa);
  fVar59 = auVar64._0_4_;
  auVar142._0_4_ = fVar59 * auVar258._0_4_;
  fVar91 = auVar64._4_4_;
  auVar142._4_4_ = fVar91 * auVar258._4_4_;
  fVar117 = auVar64._8_4_;
  auVar142._8_4_ = fVar117 * auVar258._8_4_;
  fVar92 = auVar64._12_4_;
  auVar142._12_4_ = fVar92 * auVar258._12_4_;
  auVar94._0_4_ = auVar232._0_4_ * fVar59;
  auVar94._4_4_ = auVar232._4_4_ * fVar91;
  auVar94._8_4_ = auVar232._8_4_ * fVar117;
  auVar94._12_4_ = auVar232._12_4_ * fVar92;
  auVar64._0_4_ = auVar107._0_4_ * fVar59;
  auVar64._4_4_ = auVar107._4_4_ * fVar91;
  auVar64._8_4_ = auVar107._8_4_ * fVar117;
  auVar64._12_4_ = auVar107._12_4_ * fVar92;
  auVar9 = vfmadd231ps_fma(auVar142,auVar226,auVar9);
  auVar258 = vfmadd231ps_fma(auVar94,auVar226,auVar11);
  auVar11 = vfmadd231ps_fma(auVar64,auVar226,auVar65);
  auVar232 = vfmadd231ps_fma(auVar9,auVar251,auVar12);
  auVar65 = vfmadd231ps_fma(auVar258,auVar251,auVar10);
  auVar107 = vfmadd231ps_fma(auVar11,auVar251,auVar66);
  local_3f8._8_4_ = 0x7fffffff;
  local_3f8._0_8_ = 0x7fffffff7fffffff;
  local_3f8._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar120,local_3f8);
  auVar128._8_4_ = 0x219392ef;
  auVar128._0_8_ = 0x219392ef219392ef;
  auVar128._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar128,1);
  auVar9 = vblendvps_avx(auVar120,auVar128,auVar12);
  auVar12 = vandps_avx(auVar95,local_3f8);
  auVar12 = vcmpps_avx(auVar12,auVar128,1);
  auVar258 = vblendvps_avx(auVar95,auVar128,auVar12);
  auVar12 = vandps_avx(auVar129,local_3f8);
  auVar12 = vcmpps_avx(auVar12,auVar128,1);
  auVar12 = vblendvps_avx(auVar129,auVar128,auVar12);
  auVar10 = vrcpps_avx(auVar9);
  auVar174._8_4_ = 0x3f800000;
  auVar174._0_8_ = 0x3f8000003f800000;
  auVar174._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar174);
  auVar10 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9 = vrcpps_avx(auVar258);
  auVar258 = vfnmadd213ps_fma(auVar258,auVar9,auVar174);
  auVar11 = vfmadd132ps_fma(auVar258,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar9,auVar174);
  auVar66 = vfmadd132ps_fma(auVar12,auVar9,auVar9);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar58 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar232);
  auVar129._0_4_ = auVar10._0_4_ * auVar12._0_4_;
  auVar129._4_4_ = auVar10._4_4_ * auVar12._4_4_;
  auVar129._8_4_ = auVar10._8_4_ * auVar12._8_4_;
  auVar129._12_4_ = auVar10._12_4_ * auVar12._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar58 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar9);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar232);
  auVar143._0_4_ = auVar10._0_4_ * auVar12._0_4_;
  auVar143._4_4_ = auVar10._4_4_ * auVar12._4_4_;
  auVar143._8_4_ = auVar10._8_4_ * auVar12._8_4_;
  auVar143._12_4_ = auVar10._12_4_ * auVar12._12_4_;
  auVar95._1_3_ = 0;
  auVar95[0] = PVar3;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar258);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar58 * -2 + 6);
  auVar12 = vpmovsxwd_avx(auVar10);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar65);
  auVar190._0_4_ = auVar12._0_4_ * auVar11._0_4_;
  auVar190._4_4_ = auVar12._4_4_ * auVar11._4_4_;
  auVar190._8_4_ = auVar12._8_4_ * auVar11._8_4_;
  auVar190._12_4_ = auVar12._12_4_ * auVar11._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar9);
  auVar12 = vsubps_avx(auVar12,auVar65);
  auVar226._0_4_ = auVar11._0_4_ * auVar12._0_4_;
  auVar226._4_4_ = auVar11._4_4_ * auVar12._4_4_;
  auVar226._8_4_ = auVar11._8_4_ * auVar12._8_4_;
  auVar226._12_4_ = auVar11._12_4_ * auVar12._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar51 + uVar58 + 6);
  auVar12 = vpmovsxwd_avx(auVar11);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar107);
  auVar120._0_4_ = auVar66._0_4_ * auVar12._0_4_;
  auVar120._4_4_ = auVar66._4_4_ * auVar12._4_4_;
  auVar120._8_4_ = auVar66._8_4_ * auVar12._8_4_;
  auVar120._12_4_ = auVar66._12_4_ * auVar12._12_4_;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + uVar58 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar232);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar107);
  auVar65._0_4_ = auVar66._0_4_ * auVar12._0_4_;
  auVar65._4_4_ = auVar66._4_4_ * auVar12._4_4_;
  auVar65._8_4_ = auVar66._8_4_ * auVar12._8_4_;
  auVar65._12_4_ = auVar66._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar129,auVar143);
  auVar9 = vpminsd_avx(auVar190,auVar226);
  auVar12 = vmaxps_avx(auVar12,auVar9);
  auVar9 = vpminsd_avx(auVar120,auVar65);
  uVar61 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar197._4_4_ = uVar61;
  auVar197._0_4_ = uVar61;
  auVar197._8_4_ = uVar61;
  auVar197._12_4_ = uVar61;
  auVar9 = vmaxps_avx(auVar9,auVar197);
  auVar12 = vmaxps_avx(auVar12,auVar9);
  local_258._0_4_ = auVar12._0_4_ * 0.99999964;
  local_258._4_4_ = auVar12._4_4_ * 0.99999964;
  local_258._8_4_ = auVar12._8_4_ * 0.99999964;
  local_258._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar129,auVar143);
  auVar9 = vpmaxsd_avx(auVar190,auVar226);
  auVar12 = vminps_avx(auVar12,auVar9);
  auVar9 = vpmaxsd_avx(auVar120,auVar65);
  fVar59 = ray->tfar;
  auVar107._4_4_ = fVar59;
  auVar107._0_4_ = fVar59;
  auVar107._8_4_ = fVar59;
  auVar107._12_4_ = fVar59;
  auVar9 = vminps_avx(auVar9,auVar107);
  auVar12 = vminps_avx(auVar12,auVar9);
  auVar66._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar66._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar66._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar66._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar95[4] = PVar3;
  auVar95._5_3_ = 0;
  auVar95[8] = PVar3;
  auVar95._9_3_ = 0;
  auVar95[0xc] = PVar3;
  auVar95._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar95,_DAT_01f7fcf0);
  auVar12 = vcmpps_avx(local_258,auVar66,2);
  auVar12 = vandps_avx(auVar12,auVar9);
  uVar50 = vmovmskps_avx(auVar12);
  if (uVar50 == 0) {
    return false;
  }
  uVar50 = uVar50 & 0xff;
  auVar88._16_16_ = mm_lookupmask_ps._240_16_;
  auVar88._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar88,ZEXT832(0) << 0x20,0x80);
  local_408 = 0x80000000;
  uStack_404 = 0x80000000;
  uStack_400 = 0x80000000;
  uStack_3fc = 0x80000000;
LAB_015a54b1:
  lVar52 = 0;
  uVar58 = (ulong)uVar50;
  for (uVar51 = uVar58; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
    lVar52 = lVar52 + 1;
  }
  local_4c0 = (ulong)*(uint *)(prim + 2);
  local_370 = (ulong)*(uint *)(prim + lVar52 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[local_4c0].ptr;
  uVar51 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_370);
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar12 = *(undefined1 (*) [16])(_Var7 + uVar51 * (long)pvVar6);
  auVar9 = *(undefined1 (*) [16])(_Var7 + (uVar51 + 1) * (long)pvVar6);
  auVar258 = *(undefined1 (*) [16])(_Var7 + (uVar51 + 2) * (long)pvVar6);
  auVar10 = *(undefined1 (*) [16])(_Var7 + (long)pvVar6 * (uVar51 + 3));
  lVar52 = *(long *)&pGVar4[1].time_range.upper;
  auVar11 = *(undefined1 (*) [16])(lVar52 + (long)p_Var5 * uVar51);
  auVar232 = *(undefined1 (*) [16])(lVar52 + (long)p_Var5 * (uVar51 + 1));
  auVar66 = *(undefined1 (*) [16])(lVar52 + (long)p_Var5 * (uVar51 + 2));
  uVar58 = uVar58 - 1 & uVar58;
  auVar65 = *(undefined1 (*) [16])(lVar52 + (long)p_Var5 * (uVar51 + 3));
  if (uVar58 != 0) {
    uVar57 = uVar58 - 1 & uVar58;
    for (uVar51 = uVar58; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
    }
    if (uVar57 != 0) {
      for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar95 = ZEXT816(0) << 0x40;
  auVar67._0_4_ = auVar65._0_4_ * 0.0;
  auVar67._4_4_ = auVar65._4_4_ * 0.0;
  auVar67._8_4_ = auVar65._8_4_ * 0.0;
  auVar67._12_4_ = auVar65._12_4_ * 0.0;
  auVar226 = vfmadd231ps_fma(auVar67,auVar66,auVar95);
  auVar107 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar232,auVar226);
  local_4d8._0_4_ = auVar11._0_4_ + auVar107._0_4_;
  local_4d8._4_4_ = auVar11._4_4_ + auVar107._4_4_;
  fStack_4d0 = auVar11._8_4_ + auVar107._8_4_;
  fStack_4cc = auVar11._12_4_ + auVar107._12_4_;
  auVar240._8_4_ = 0x40400000;
  auVar240._0_8_ = 0x4040000040400000;
  auVar240._12_4_ = 0x40400000;
  auVar107 = vfmadd231ps_fma(auVar226,auVar232,auVar240);
  auVar64 = vfnmadd231ps_fma(auVar107,auVar11,auVar240);
  auVar224._0_4_ = auVar10._0_4_ * 0.0;
  auVar224._4_4_ = auVar10._4_4_ * 0.0;
  auVar224._8_4_ = auVar10._8_4_ * 0.0;
  auVar224._12_4_ = auVar10._12_4_ * 0.0;
  auVar226 = vfmadd231ps_fma(auVar224,auVar258,auVar95);
  auVar107 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar9,auVar226);
  auVar231._0_4_ = auVar12._0_4_ + auVar107._0_4_;
  auVar231._4_4_ = auVar12._4_4_ + auVar107._4_4_;
  auVar231._8_4_ = auVar12._8_4_ + auVar107._8_4_;
  auVar231._12_4_ = auVar12._12_4_ + auVar107._12_4_;
  auVar107 = vfmadd231ps_fma(auVar226,auVar9,auVar240);
  auVar226 = vfnmadd231ps_fma(auVar107,auVar12,auVar240);
  auVar107 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar66,auVar65);
  auVar107 = vfmadd231ps_fma(auVar107,auVar232,auVar95);
  auVar107 = vfmadd231ps_fma(auVar107,auVar11,auVar95);
  auVar118._0_4_ = auVar65._0_4_ * 3.0;
  auVar118._4_4_ = auVar65._4_4_ * 3.0;
  auVar118._8_4_ = auVar65._8_4_ * 3.0;
  auVar118._12_4_ = auVar65._12_4_ * 3.0;
  auVar66 = vfnmadd231ps_fma(auVar118,auVar240,auVar66);
  auVar232 = vfmadd231ps_fma(auVar66,auVar95,auVar232);
  auVar66 = vfnmadd231ps_fma(auVar232,auVar95,auVar11);
  auVar11 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar258,auVar10);
  auVar11 = vfmadd231ps_fma(auVar11,auVar9,auVar95);
  auVar11 = vfmadd231ps_fma(auVar11,auVar12,auVar95);
  auVar198._0_4_ = auVar10._0_4_ * 3.0;
  auVar198._4_4_ = auVar10._4_4_ * 3.0;
  auVar198._8_4_ = auVar10._8_4_ * 3.0;
  auVar198._12_4_ = auVar10._12_4_ * 3.0;
  auVar258 = vfnmadd231ps_fma(auVar198,auVar240,auVar258);
  auVar9 = vfmadd231ps_fma(auVar258,auVar95,auVar9);
  auVar232 = vfnmadd231ps_fma(auVar9,auVar95,auVar12);
  auVar12 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar9 = vshufps_avx(auVar231,auVar231,0xc9);
  fVar60 = auVar64._0_4_;
  auVar144._0_4_ = fVar60 * auVar9._0_4_;
  fVar62 = auVar64._4_4_;
  auVar144._4_4_ = fVar62 * auVar9._4_4_;
  fVar140 = auVar64._8_4_;
  auVar144._8_4_ = fVar140 * auVar9._8_4_;
  fVar210 = auVar64._12_4_;
  auVar144._12_4_ = fVar210 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar144,auVar12,auVar231);
  auVar258 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar226,auVar226,0xc9);
  auVar145._0_4_ = fVar60 * auVar9._0_4_;
  auVar145._4_4_ = fVar62 * auVar9._4_4_;
  auVar145._8_4_ = fVar140 * auVar9._8_4_;
  auVar145._12_4_ = fVar210 * auVar9._12_4_;
  auVar12 = vfmsub231ps_fma(auVar145,auVar12,auVar226);
  auVar10 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar9 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar173 = auVar66._0_4_;
  auVar130._0_4_ = fVar173 * auVar9._0_4_;
  fVar186 = auVar66._4_4_;
  auVar130._4_4_ = fVar186 * auVar9._4_4_;
  fVar187 = auVar66._8_4_;
  auVar130._8_4_ = fVar187 * auVar9._8_4_;
  fVar188 = auVar66._12_4_;
  auVar130._12_4_ = fVar188 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar130,auVar12,auVar11);
  auVar11 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar232,auVar232,0xc9);
  auVar160._0_4_ = fVar173 * auVar9._0_4_;
  auVar160._4_4_ = fVar186 * auVar9._4_4_;
  auVar160._8_4_ = fVar187 * auVar9._8_4_;
  auVar160._12_4_ = fVar188 * auVar9._12_4_;
  auVar12 = vfmsub231ps_fma(auVar160,auVar12,auVar232);
  auVar232 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vdpps_avx(auVar258,auVar258,0x7f);
  fVar91 = auVar12._0_4_;
  auVar199._4_12_ = ZEXT812(0) << 0x20;
  auVar199._0_4_ = fVar91;
  auVar9 = vrsqrtss_avx(auVar199,auVar199);
  fVar59 = auVar9._0_4_;
  fVar117 = fVar59 * 1.5 - fVar91 * 0.5 * fVar59 * fVar59 * fVar59;
  auVar9 = vdpps_avx(auVar258,auVar10,0x7f);
  fVar139 = fVar117 * auVar258._0_4_;
  fVar157 = fVar117 * auVar258._4_4_;
  fVar158 = fVar117 * auVar258._8_4_;
  fVar159 = fVar117 * auVar258._12_4_;
  auVar212._0_4_ = auVar10._0_4_ * fVar91;
  auVar212._4_4_ = auVar10._4_4_ * fVar91;
  auVar212._8_4_ = auVar10._8_4_ * fVar91;
  auVar212._12_4_ = auVar10._12_4_ * fVar91;
  fVar59 = auVar9._0_4_;
  auVar175._0_4_ = fVar59 * auVar258._0_4_;
  auVar175._4_4_ = fVar59 * auVar258._4_4_;
  auVar175._8_4_ = fVar59 * auVar258._8_4_;
  auVar175._12_4_ = fVar59 * auVar258._12_4_;
  auVar258 = vsubps_avx(auVar212,auVar175);
  auVar9 = vrcpss_avx(auVar199,auVar199);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar59 = auVar9._0_4_ * auVar12._0_4_;
  auVar12 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar91 = auVar12._0_4_;
  auVar200._4_12_ = ZEXT812(0) << 0x20;
  auVar200._0_4_ = fVar91;
  auVar9 = vrsqrtss_avx(auVar200,auVar200);
  fVar92 = auVar9._0_4_;
  auVar9 = vdpps_avx(auVar11,auVar232,0x7f);
  fVar92 = fVar92 * 1.5 - fVar91 * 0.5 * fVar92 * fVar92 * fVar92;
  fVar239 = fVar92 * auVar11._0_4_;
  fVar247 = fVar92 * auVar11._4_4_;
  fVar248 = fVar92 * auVar11._8_4_;
  fVar249 = fVar92 * auVar11._12_4_;
  auVar161._0_4_ = fVar91 * auVar232._0_4_;
  auVar161._4_4_ = fVar91 * auVar232._4_4_;
  auVar161._8_4_ = fVar91 * auVar232._8_4_;
  auVar161._12_4_ = fVar91 * auVar232._12_4_;
  fVar91 = auVar9._0_4_;
  auVar131._0_4_ = fVar91 * auVar11._0_4_;
  auVar131._4_4_ = fVar91 * auVar11._4_4_;
  auVar131._8_4_ = fVar91 * auVar11._8_4_;
  auVar131._12_4_ = fVar91 * auVar11._12_4_;
  auVar10 = vsubps_avx(auVar161,auVar131);
  auVar9 = vrcpss_avx(auVar200,auVar200);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar9,ZEXT416(0x40000000));
  fVar91 = auVar12._0_4_ * auVar9._0_4_;
  auVar12 = vshufps_avx(_local_4d8,_local_4d8,0xff);
  auVar191._0_4_ = auVar12._0_4_ * fVar139;
  auVar191._4_4_ = auVar12._4_4_ * fVar157;
  auVar191._8_4_ = auVar12._8_4_ * fVar158;
  auVar191._12_4_ = auVar12._12_4_ * fVar159;
  local_418 = vsubps_avx(_local_4d8,auVar191);
  auVar9 = vshufps_avx(auVar64,auVar64,0xff);
  auVar146._0_4_ = auVar9._0_4_ * fVar139 + auVar12._0_4_ * fVar117 * fVar59 * auVar258._0_4_;
  auVar146._4_4_ = auVar9._4_4_ * fVar157 + auVar12._4_4_ * fVar117 * fVar59 * auVar258._4_4_;
  auVar146._8_4_ = auVar9._8_4_ * fVar158 + auVar12._8_4_ * fVar117 * fVar59 * auVar258._8_4_;
  auVar146._12_4_ = auVar9._12_4_ * fVar159 + auVar12._12_4_ * fVar117 * fVar59 * auVar258._12_4_;
  auVar258 = vsubps_avx(auVar64,auVar146);
  local_428._0_4_ = auVar191._0_4_ + (float)local_4d8._0_4_;
  local_428._4_4_ = auVar191._4_4_ + (float)local_4d8._4_4_;
  fStack_420 = auVar191._8_4_ + fStack_4d0;
  fStack_41c = auVar191._12_4_ + fStack_4cc;
  auVar12 = vshufps_avx(auVar107,auVar107,0xff);
  auVar96._0_4_ = fVar239 * auVar12._0_4_;
  auVar96._4_4_ = fVar247 * auVar12._4_4_;
  auVar96._8_4_ = fVar248 * auVar12._8_4_;
  auVar96._12_4_ = fVar249 * auVar12._12_4_;
  local_438 = vsubps_avx(auVar107,auVar96);
  auVar9 = vshufps_avx(auVar66,auVar66,0xff);
  auVar68._0_4_ = fVar239 * auVar9._0_4_ + auVar12._0_4_ * fVar92 * auVar10._0_4_ * fVar91;
  auVar68._4_4_ = fVar247 * auVar9._4_4_ + auVar12._4_4_ * fVar92 * auVar10._4_4_ * fVar91;
  auVar68._8_4_ = fVar248 * auVar9._8_4_ + auVar12._8_4_ * fVar92 * auVar10._8_4_ * fVar91;
  auVar68._12_4_ = fVar249 * auVar9._12_4_ + auVar12._12_4_ * fVar92 * auVar10._12_4_ * fVar91;
  auVar12 = vsubps_avx(auVar66,auVar68);
  local_4b8 = auVar107._0_4_ + auVar96._0_4_;
  fStack_4b4 = auVar107._4_4_ + auVar96._4_4_;
  fStack_4b0 = auVar107._8_4_ + auVar96._8_4_;
  fStack_4ac = auVar107._12_4_ + auVar96._12_4_;
  local_448._0_4_ = local_418._0_4_ + auVar258._0_4_ * 0.33333334;
  local_448._4_4_ = local_418._4_4_ + auVar258._4_4_ * 0.33333334;
  local_448._8_4_ = local_418._8_4_ + auVar258._8_4_ * 0.33333334;
  local_448._12_4_ = local_418._12_4_ + auVar258._12_4_ * 0.33333334;
  auVar69._0_4_ = auVar12._0_4_ * 0.33333334;
  auVar69._4_4_ = auVar12._4_4_ * 0.33333334;
  auVar69._8_4_ = auVar12._8_4_ * 0.33333334;
  auVar69._12_4_ = auVar12._12_4_ * 0.33333334;
  local_458 = vsubps_avx(local_438,auVar69);
  aVar1 = (ray->org).field_0;
  auVar258 = vsubps_avx(local_418,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar258,auVar258,0x55);
  auVar9 = vshufps_avx(auVar258,auVar258,0xaa);
  aVar2 = (pre->ray_space).vy.field_0;
  fVar59 = (pre->ray_space).vz.field_0.m128[0];
  fVar91 = (pre->ray_space).vz.field_0.m128[1];
  fVar117 = (pre->ray_space).vz.field_0.m128[2];
  fVar92 = (pre->ray_space).vz.field_0.m128[3];
  auVar70._0_4_ = fVar59 * auVar9._0_4_;
  auVar70._4_4_ = fVar91 * auVar9._4_4_;
  auVar70._8_4_ = fVar117 * auVar9._8_4_;
  auVar70._12_4_ = fVar92 * auVar9._12_4_;
  auVar226 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar2,auVar12);
  auVar10 = vsubps_avx(local_448,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar10,auVar10,0x55);
  auVar9 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar71._0_4_ = fVar59 * auVar9._0_4_;
  auVar71._4_4_ = fVar91 * auVar9._4_4_;
  auVar71._8_4_ = fVar117 * auVar9._8_4_;
  auVar71._12_4_ = fVar92 * auVar9._12_4_;
  auVar64 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar2,auVar12);
  auVar9 = vsubps_avx(local_458,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar72._0_4_ = fVar59 * auVar12._0_4_;
  auVar72._4_4_ = fVar91 * auVar12._4_4_;
  auVar72._8_4_ = fVar117 * auVar12._8_4_;
  auVar72._12_4_ = fVar92 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar9,auVar9,0x55);
  auVar95 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar2,auVar12);
  auVar11 = vsubps_avx(local_438,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar73._0_4_ = fVar59 * auVar12._0_4_;
  auVar73._4_4_ = fVar91 * auVar12._4_4_;
  auVar73._8_4_ = fVar117 * auVar12._8_4_;
  auVar73._12_4_ = fVar92 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar11,auVar11,0x55);
  auVar120 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar2,auVar12);
  auVar232 = vsubps_avx(_local_428,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar232,auVar232,0xaa);
  auVar147._0_4_ = fVar59 * auVar12._0_4_;
  auVar147._4_4_ = fVar91 * auVar12._4_4_;
  auVar147._8_4_ = fVar117 * auVar12._8_4_;
  auVar147._12_4_ = fVar92 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar232,auVar232,0x55);
  auVar129 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar2,auVar12);
  local_468._0_4_ = (fVar60 + auVar146._0_4_) * 0.33333334 + (float)local_428._0_4_;
  local_468._4_4_ = (fVar62 + auVar146._4_4_) * 0.33333334 + (float)local_428._4_4_;
  fStack_460 = (fVar140 + auVar146._8_4_) * 0.33333334 + fStack_420;
  fStack_45c = (fVar210 + auVar146._12_4_) * 0.33333334 + fStack_41c;
  auVar66 = vsubps_avx(_local_468,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar66,auVar66,0xaa);
  auVar225._0_4_ = fVar59 * auVar12._0_4_;
  auVar225._4_4_ = fVar91 * auVar12._4_4_;
  auVar225._8_4_ = fVar117 * auVar12._8_4_;
  auVar225._12_4_ = fVar92 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar66,auVar66,0x55);
  auVar63 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar2,auVar12);
  auVar213._0_4_ = (fVar173 + auVar68._0_4_) * 0.33333334;
  auVar213._4_4_ = (fVar186 + auVar68._4_4_) * 0.33333334;
  auVar213._8_4_ = (fVar187 + auVar68._8_4_) * 0.33333334;
  auVar213._12_4_ = (fVar188 + auVar68._12_4_) * 0.33333334;
  auVar43._4_4_ = fStack_4b4;
  auVar43._0_4_ = local_4b8;
  auVar43._8_4_ = fStack_4b0;
  auVar43._12_4_ = fStack_4ac;
  _local_478 = vsubps_avx(auVar43,auVar213);
  auVar65 = vsubps_avx(_local_478,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar65,auVar65,0xaa);
  auVar214._0_4_ = fVar59 * auVar12._0_4_;
  auVar214._4_4_ = fVar91 * auVar12._4_4_;
  auVar214._8_4_ = fVar117 * auVar12._8_4_;
  auVar214._12_4_ = fVar92 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar65,auVar65,0x55);
  auVar94 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar2,auVar12);
  auVar107 = vsubps_avx(auVar43,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar107,auVar107,0xaa);
  auVar176._0_4_ = fVar59 * auVar12._0_4_;
  auVar176._4_4_ = fVar91 * auVar12._4_4_;
  auVar176._8_4_ = fVar117 * auVar12._8_4_;
  auVar176._12_4_ = fVar92 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar107,auVar107,0x55);
  auVar12 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar2,auVar12);
  local_4d8._0_4_ = auVar258._0_4_;
  auVar162._4_4_ = local_4d8._0_4_;
  auVar162._0_4_ = local_4d8._0_4_;
  auVar162._8_4_ = local_4d8._0_4_;
  auVar162._12_4_ = local_4d8._0_4_;
  aVar2 = (pre->ray_space).vx.field_0;
  auVar226 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar2,auVar162);
  local_4e8._0_4_ = auVar10._0_4_;
  auVar163._4_4_ = local_4e8._0_4_;
  auVar163._0_4_ = local_4e8._0_4_;
  auVar163._8_4_ = local_4e8._0_4_;
  auVar163._12_4_ = local_4e8._0_4_;
  auVar10 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar2,auVar163);
  uVar61 = auVar9._0_4_;
  auVar164._4_4_ = uVar61;
  auVar164._0_4_ = uVar61;
  auVar164._8_4_ = uVar61;
  auVar164._12_4_ = uVar61;
  auVar64 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar2,auVar164);
  uVar61 = auVar11._0_4_;
  auVar165._4_4_ = uVar61;
  auVar165._0_4_ = uVar61;
  auVar165._8_4_ = uVar61;
  auVar165._12_4_ = uVar61;
  auVar11 = vfmadd231ps_fma(auVar120,(undefined1  [16])aVar2,auVar165);
  uVar61 = auVar232._0_4_;
  auVar166._4_4_ = uVar61;
  auVar166._0_4_ = uVar61;
  auVar166._8_4_ = uVar61;
  auVar166._12_4_ = uVar61;
  auVar232 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar2,auVar166);
  uVar61 = auVar66._0_4_;
  auVar167._4_4_ = uVar61;
  auVar167._0_4_ = uVar61;
  auVar167._8_4_ = uVar61;
  auVar167._12_4_ = uVar61;
  auVar66 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar167);
  uVar61 = auVar65._0_4_;
  auVar74._4_4_ = uVar61;
  auVar74._0_4_ = uVar61;
  auVar74._8_4_ = uVar61;
  auVar74._12_4_ = uVar61;
  auVar65 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar2,auVar74);
  uVar61 = auVar107._0_4_;
  auVar75._4_4_ = uVar61;
  auVar75._0_4_ = uVar61;
  auVar75._8_4_ = uVar61;
  auVar75._12_4_ = uVar61;
  auVar107 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar75);
  local_488 = vmovlhps_avx(auVar226,auVar232);
  local_4e8 = vmovlhps_avx(auVar10,auVar66);
  local_4f8 = vmovlhps_avx(auVar64,auVar65);
  _local_238 = vmovlhps_avx(auVar11,auVar107);
  auVar12 = vminps_avx(local_488,local_4e8);
  auVar9 = vminps_avx(local_4f8,_local_238);
  auVar258 = vminps_avx(auVar12,auVar9);
  auVar12 = vmaxps_avx(local_488,local_4e8);
  auVar9 = vmaxps_avx(local_4f8,_local_238);
  auVar12 = vmaxps_avx(auVar12,auVar9);
  auVar9 = vshufpd_avx(auVar258,auVar258,3);
  auVar258 = vminps_avx(auVar258,auVar9);
  auVar9 = vshufpd_avx(auVar12,auVar12,3);
  auVar9 = vmaxps_avx(auVar12,auVar9);
  auVar12 = vandps_avx(local_3f8,auVar258);
  auVar9 = vandps_avx(local_3f8,auVar9);
  auVar12 = vmaxps_avx(auVar12,auVar9);
  auVar9 = vmovshdup_avx(auVar12);
  auVar12 = vmaxss_avx(auVar9,auVar12);
  local_198 = auVar12._0_4_ * 9.536743e-07;
  local_388._8_8_ = auVar226._0_8_;
  local_388._0_8_ = auVar226._0_8_;
  local_398._8_8_ = auVar10._0_8_;
  local_398._0_8_ = auVar10._0_8_;
  local_3a8._8_8_ = auVar64._0_8_;
  local_3a8._0_8_ = auVar64._0_8_;
  local_3b8._8_8_ = auVar11._0_8_;
  local_3b8._0_8_ = auVar11._0_8_;
  register0x000012c8 = auVar232._0_8_;
  local_3c8 = auVar232._0_8_;
  local_3d8 = auVar65._0_8_;
  register0x00001488 = local_3d8;
  register0x00001348 = auVar107._0_8_;
  local_3e8 = auVar107._0_8_;
  _local_4d8 = ZEXT416((uint)local_198);
  local_1b8 = (uint)local_198 ^ local_408;
  uStack_1b4 = local_1b8;
  uStack_1b0 = local_1b8;
  uStack_1ac = local_1b8;
  uStack_1a8 = local_1b8;
  uStack_1a4 = local_1b8;
  uStack_1a0 = local_1b8;
  uStack_19c = local_1b8;
  bVar56 = false;
  uVar50 = 0;
  local_208 = vsubps_avx(local_4e8,local_488);
  local_218 = vsubps_avx(local_4f8,local_4e8);
  local_228 = vsubps_avx(_local_238,local_4f8);
  local_268 = vsubps_avx(_local_428,local_418);
  local_278 = vsubps_avx(_local_468,local_448);
  local_288 = vsubps_avx(_local_478,local_458);
  auVar44._4_4_ = fStack_4b4;
  auVar44._0_4_ = local_4b8;
  auVar44._8_4_ = fStack_4b0;
  auVar44._12_4_ = fStack_4ac;
  _local_298 = vsubps_avx(auVar44,local_438);
  auVar76 = ZEXT816(0x3f80000000000000);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_248 = auVar76;
LAB_015a5c06:
  auVar12 = vshufps_avx(auVar76,auVar76,0x50);
  auVar257._8_4_ = 0x3f800000;
  auVar257._0_8_ = 0x3f8000003f800000;
  auVar257._12_4_ = 0x3f800000;
  auVar261._16_4_ = 0x3f800000;
  auVar261._0_16_ = auVar257;
  auVar261._20_4_ = 0x3f800000;
  auVar261._24_4_ = 0x3f800000;
  auVar261._28_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar257,auVar12);
  fVar59 = auVar12._0_4_;
  auVar77._0_4_ = local_3c8._0_4_ * fVar59;
  fVar91 = auVar12._4_4_;
  auVar77._4_4_ = local_3c8._4_4_ * fVar91;
  fVar117 = auVar12._8_4_;
  auVar77._8_4_ = local_3c8._8_4_ * fVar117;
  fVar92 = auVar12._12_4_;
  auVar77._12_4_ = local_3c8._12_4_ * fVar92;
  fVar159 = auVar66._0_4_;
  auVar168._0_4_ = fVar159 * fVar59;
  fVar239 = auVar66._4_4_;
  auVar168._4_4_ = fVar239 * fVar91;
  auVar168._8_4_ = fVar159 * fVar117;
  auVar168._12_4_ = fVar239 * fVar92;
  auVar132._0_4_ = local_3d8._0_4_ * fVar59;
  auVar132._4_4_ = local_3d8._4_4_ * fVar91;
  auVar132._8_4_ = local_3d8._8_4_ * fVar117;
  auVar132._12_4_ = local_3d8._12_4_ * fVar92;
  auVar108._0_4_ = local_3e8._0_4_ * fVar59;
  auVar108._4_4_ = local_3e8._4_4_ * fVar91;
  auVar108._8_4_ = local_3e8._8_4_ * fVar117;
  auVar108._12_4_ = local_3e8._12_4_ * fVar92;
  auVar11 = vfmadd231ps_fma(auVar77,auVar9,local_388);
  auVar232 = vfmadd231ps_fma(auVar168,auVar9,local_398);
  auVar65 = vfmadd231ps_fma(auVar132,auVar9,local_3a8);
  auVar107 = vfmadd231ps_fma(auVar108,local_3b8,auVar9);
  auVar12 = vmovshdup_avx(local_248);
  fVar59 = local_248._0_4_;
  fStack_e0 = (auVar12._0_4_ - fVar59) * 0.04761905;
  auVar208._4_4_ = fVar59;
  auVar208._0_4_ = fVar59;
  auVar208._8_4_ = fVar59;
  auVar208._12_4_ = fVar59;
  auVar208._16_4_ = fVar59;
  auVar208._20_4_ = fVar59;
  auVar208._24_4_ = fVar59;
  auVar208._28_4_ = fVar59;
  auVar104._0_8_ = auVar12._0_8_;
  auVar104._8_8_ = auVar104._0_8_;
  auVar104._16_8_ = auVar104._0_8_;
  auVar104._24_8_ = auVar104._0_8_;
  auVar88 = vsubps_avx(auVar104,auVar208);
  uVar61 = auVar11._0_4_;
  auVar255._4_4_ = uVar61;
  auVar255._0_4_ = uVar61;
  auVar255._8_4_ = uVar61;
  auVar255._12_4_ = uVar61;
  auVar255._16_4_ = uVar61;
  auVar255._20_4_ = uVar61;
  auVar255._24_4_ = uVar61;
  auVar255._28_4_ = uVar61;
  auVar12 = vmovshdup_avx(auVar11);
  uVar93 = auVar12._0_8_;
  auVar246._8_8_ = uVar93;
  auVar246._0_8_ = uVar93;
  auVar246._16_8_ = uVar93;
  auVar246._24_8_ = uVar93;
  fVar173 = auVar232._0_4_;
  auVar236._4_4_ = fVar173;
  auVar236._0_4_ = fVar173;
  auVar236._8_4_ = fVar173;
  auVar236._12_4_ = fVar173;
  auVar236._16_4_ = fVar173;
  auVar236._20_4_ = fVar173;
  auVar236._24_4_ = fVar173;
  auVar236._28_4_ = fVar173;
  auVar9 = vmovshdup_avx(auVar232);
  auVar105._0_8_ = auVar9._0_8_;
  auVar105._8_8_ = auVar105._0_8_;
  auVar105._16_8_ = auVar105._0_8_;
  auVar105._24_8_ = auVar105._0_8_;
  fVar210 = auVar65._0_4_;
  auVar183._4_4_ = fVar210;
  auVar183._0_4_ = fVar210;
  auVar183._8_4_ = fVar210;
  auVar183._12_4_ = fVar210;
  auVar183._16_4_ = fVar210;
  auVar183._20_4_ = fVar210;
  auVar183._24_4_ = fVar210;
  auVar183._28_4_ = fVar210;
  auVar258 = vmovshdup_avx(auVar65);
  auVar195._0_8_ = auVar258._0_8_;
  auVar195._8_8_ = auVar195._0_8_;
  auVar195._16_8_ = auVar195._0_8_;
  auVar195._24_8_ = auVar195._0_8_;
  fVar140 = auVar107._0_4_;
  auVar10 = vmovshdup_avx(auVar107);
  auVar226 = vfmadd132ps_fma(auVar88,auVar208,_DAT_01faff20);
  auVar88 = vsubps_avx(auVar261,ZEXT1632(auVar226));
  fVar59 = auVar226._0_4_;
  fVar91 = auVar226._4_4_;
  auVar13._4_4_ = fVar173 * fVar91;
  auVar13._0_4_ = fVar173 * fVar59;
  fVar117 = auVar226._8_4_;
  auVar13._8_4_ = fVar173 * fVar117;
  fVar92 = auVar226._12_4_;
  auVar13._12_4_ = fVar173 * fVar92;
  auVar13._16_4_ = fVar173 * 0.0;
  auVar13._20_4_ = fVar173 * 0.0;
  auVar13._24_4_ = fVar173 * 0.0;
  auVar13._28_4_ = 0x3f800000;
  auVar226 = vfmadd231ps_fma(auVar13,auVar88,auVar255);
  fVar60 = auVar9._0_4_;
  fVar62 = auVar9._4_4_;
  auVar14._4_4_ = fVar62 * fVar91;
  auVar14._0_4_ = fVar60 * fVar59;
  auVar14._8_4_ = fVar60 * fVar117;
  auVar14._12_4_ = fVar62 * fVar92;
  auVar14._16_4_ = fVar60 * 0.0;
  auVar14._20_4_ = fVar62 * 0.0;
  auVar14._24_4_ = fVar60 * 0.0;
  auVar14._28_4_ = uVar61;
  auVar64 = vfmadd231ps_fma(auVar14,auVar88,auVar246);
  auVar15._4_4_ = fVar210 * fVar91;
  auVar15._0_4_ = fVar210 * fVar59;
  auVar15._8_4_ = fVar210 * fVar117;
  auVar15._12_4_ = fVar210 * fVar92;
  auVar15._16_4_ = fVar210 * 0.0;
  auVar15._20_4_ = fVar210 * 0.0;
  auVar15._24_4_ = fVar210 * 0.0;
  auVar15._28_4_ = auVar12._4_4_;
  auVar95 = vfmadd231ps_fma(auVar15,auVar88,auVar236);
  fVar60 = auVar258._0_4_;
  fVar62 = auVar258._4_4_;
  auVar8._4_4_ = fVar62 * fVar91;
  auVar8._0_4_ = fVar60 * fVar59;
  auVar8._8_4_ = fVar60 * fVar117;
  auVar8._12_4_ = fVar62 * fVar92;
  auVar8._16_4_ = fVar60 * 0.0;
  auVar8._20_4_ = fVar62 * 0.0;
  auVar8._24_4_ = fVar60 * 0.0;
  auVar8._28_4_ = fVar173;
  auVar120 = vfmadd231ps_fma(auVar8,auVar88,auVar105);
  auVar12 = vshufps_avx(auVar11,auVar11,0xaa);
  local_4a8._8_8_ = auVar12._0_8_;
  local_4a8._0_8_ = local_4a8._8_8_;
  local_4a8._16_8_ = local_4a8._8_8_;
  local_4a8._24_8_ = local_4a8._8_8_;
  auVar9 = vshufps_avx(auVar11,auVar11,0xff);
  uStack_510 = auVar9._0_8_;
  local_518 = (undefined1  [8])uStack_510;
  uStack_508 = uStack_510;
  uStack_500 = uStack_510;
  auVar16._4_4_ = fVar140 * fVar91;
  auVar16._0_4_ = fVar140 * fVar59;
  auVar16._8_4_ = fVar140 * fVar117;
  auVar16._12_4_ = fVar140 * fVar92;
  auVar16._16_4_ = fVar140 * 0.0;
  auVar16._20_4_ = fVar140 * 0.0;
  auVar16._24_4_ = fVar140 * 0.0;
  auVar16._28_4_ = fVar140;
  auVar11 = vfmadd231ps_fma(auVar16,auVar88,auVar183);
  auVar9 = vshufps_avx(auVar232,auVar232,0xaa);
  auVar184._0_8_ = auVar9._0_8_;
  auVar184._8_8_ = auVar184._0_8_;
  auVar184._16_8_ = auVar184._0_8_;
  auVar184._24_8_ = auVar184._0_8_;
  auVar258 = vshufps_avx(auVar232,auVar232,0xff);
  local_368._8_8_ = auVar258._0_8_;
  local_368._0_8_ = local_368._8_8_;
  local_368._16_8_ = local_368._8_8_;
  local_368._24_8_ = local_368._8_8_;
  fVar60 = auVar10._0_4_;
  fVar62 = auVar10._4_4_;
  auVar238._4_4_ = fVar62 * fVar91;
  auVar238._0_4_ = fVar60 * fVar59;
  auVar238._8_4_ = fVar60 * fVar117;
  auVar238._12_4_ = fVar62 * fVar92;
  auVar238._16_4_ = fVar60 * 0.0;
  auVar238._20_4_ = fVar62 * 0.0;
  auVar238._24_4_ = fVar60 * 0.0;
  auVar238._28_4_ = auVar12._4_4_;
  auVar129 = vfmadd231ps_fma(auVar238,auVar88,auVar195);
  auVar18._28_4_ = fVar62;
  auVar18._0_28_ =
       ZEXT1628(CONCAT412(auVar95._12_4_ * fVar92,
                          CONCAT48(auVar95._8_4_ * fVar117,
                                   CONCAT44(auVar95._4_4_ * fVar91,auVar95._0_4_ * fVar59))));
  auVar226 = vfmadd231ps_fma(auVar18,auVar88,ZEXT1632(auVar226));
  fVar60 = auVar258._4_4_;
  auVar19._28_4_ = fVar60;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar120._12_4_ * fVar92,
                          CONCAT48(auVar120._8_4_ * fVar117,
                                   CONCAT44(auVar120._4_4_ * fVar91,auVar120._0_4_ * fVar59))));
  auVar64 = vfmadd231ps_fma(auVar19,auVar88,ZEXT1632(auVar64));
  auVar12 = vshufps_avx(auVar65,auVar65,0xaa);
  uVar93 = auVar12._0_8_;
  auVar172._8_8_ = uVar93;
  auVar172._0_8_ = uVar93;
  auVar172._16_8_ = uVar93;
  auVar172._24_8_ = uVar93;
  auVar10 = vshufps_avx(auVar65,auVar65,0xff);
  uVar93 = auVar10._0_8_;
  auVar262._8_8_ = uVar93;
  auVar262._0_8_ = uVar93;
  auVar262._16_8_ = uVar93;
  auVar262._24_8_ = uVar93;
  auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar92,
                                               CONCAT48(auVar11._8_4_ * fVar117,
                                                        CONCAT44(auVar11._4_4_ * fVar91,
                                                                 auVar11._0_4_ * fVar59)))),auVar88,
                            ZEXT1632(auVar95));
  auVar11 = vshufps_avx(auVar107,auVar107,0xaa);
  auVar232 = vshufps_avx(auVar107,auVar107,0xff);
  auVar107 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar129._12_4_,
                                                CONCAT48(fVar117 * auVar129._8_4_,
                                                         CONCAT44(fVar91 * auVar129._4_4_,
                                                                  fVar59 * auVar129._0_4_)))),
                             auVar88,ZEXT1632(auVar120));
  auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar65._12_4_,
                                               CONCAT48(fVar117 * auVar65._8_4_,
                                                        CONCAT44(fVar91 * auVar65._4_4_,
                                                                 fVar59 * auVar65._0_4_)))),auVar88,
                            ZEXT1632(auVar226));
  auVar13 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar226));
  auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar107._12_4_,
                                               CONCAT48(fVar117 * auVar107._8_4_,
                                                        CONCAT44(fVar91 * auVar107._4_4_,
                                                                 fVar59 * auVar107._0_4_)))),auVar88
                            ,ZEXT1632(auVar64));
  auVar14 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar64));
  fStack_2fc = auVar14._28_4_;
  auVar237._0_4_ = fStack_e0 * auVar13._0_4_ * 3.0;
  auVar237._4_4_ = fStack_e0 * auVar13._4_4_ * 3.0;
  auVar237._8_4_ = fStack_e0 * auVar13._8_4_ * 3.0;
  auVar237._12_4_ = fStack_e0 * auVar13._12_4_ * 3.0;
  auVar237._16_4_ = fStack_e0 * auVar13._16_4_ * 3.0;
  auVar237._20_4_ = fStack_e0 * auVar13._20_4_ * 3.0;
  auVar237._24_4_ = fStack_e0 * auVar13._24_4_ * 3.0;
  auVar237._28_4_ = 0;
  local_318._0_4_ = fStack_e0 * auVar14._0_4_ * 3.0;
  local_318._4_4_ = fStack_e0 * auVar14._4_4_ * 3.0;
  fStack_310 = fStack_e0 * auVar14._8_4_ * 3.0;
  fStack_30c = fStack_e0 * auVar14._12_4_ * 3.0;
  fStack_308 = fStack_e0 * auVar14._16_4_ * 3.0;
  fStack_304 = fStack_e0 * auVar14._20_4_ * 3.0;
  fStack_300 = fStack_e0 * auVar14._24_4_ * 3.0;
  fVar62 = auVar9._0_4_;
  fVar140 = auVar9._4_4_;
  auVar20._4_4_ = fVar140 * fVar91;
  auVar20._0_4_ = fVar62 * fVar59;
  auVar20._8_4_ = fVar62 * fVar117;
  auVar20._12_4_ = fVar140 * fVar92;
  auVar20._16_4_ = fVar62 * 0.0;
  auVar20._20_4_ = fVar140 * 0.0;
  auVar20._24_4_ = fVar62 * 0.0;
  auVar20._28_4_ = fStack_2fc;
  auVar9 = vfmadd231ps_fma(auVar20,auVar88,local_4a8);
  fVar62 = auVar258._0_4_;
  auVar21._4_4_ = fVar60 * fVar91;
  auVar21._0_4_ = fVar62 * fVar59;
  auVar21._8_4_ = fVar62 * fVar117;
  auVar21._12_4_ = fVar60 * fVar92;
  auVar21._16_4_ = fVar62 * 0.0;
  auVar21._20_4_ = fVar60 * 0.0;
  auVar21._24_4_ = fVar62 * 0.0;
  auVar21._28_4_ = 0;
  auVar258 = vfmadd231ps_fma(auVar21,auVar88,_local_518);
  fVar60 = auVar12._0_4_;
  fVar62 = auVar12._4_4_;
  auVar22._4_4_ = fVar62 * fVar91;
  auVar22._0_4_ = fVar60 * fVar59;
  auVar22._8_4_ = fVar60 * fVar117;
  auVar22._12_4_ = fVar62 * fVar92;
  auVar22._16_4_ = fVar60 * 0.0;
  auVar22._20_4_ = fVar62 * 0.0;
  auVar22._24_4_ = fVar60 * 0.0;
  auVar22._28_4_ = auVar13._28_4_;
  auVar12 = vfmadd231ps_fma(auVar22,auVar88,auVar184);
  fVar60 = auVar10._0_4_;
  fVar210 = auVar10._4_4_;
  auVar23._4_4_ = fVar210 * fVar91;
  auVar23._0_4_ = fVar60 * fVar59;
  auVar23._8_4_ = fVar60 * fVar117;
  auVar23._12_4_ = fVar210 * fVar92;
  auVar23._16_4_ = fVar60 * 0.0;
  auVar23._20_4_ = fVar210 * 0.0;
  auVar23._24_4_ = fVar60 * 0.0;
  auVar23._28_4_ = fVar140;
  auVar10 = vfmadd231ps_fma(auVar23,auVar88,local_368);
  local_368 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar95));
  fVar60 = auVar11._0_4_;
  fVar62 = auVar11._4_4_;
  auVar24._4_4_ = fVar62 * fVar91;
  auVar24._0_4_ = fVar60 * fVar59;
  auVar24._8_4_ = fVar60 * fVar117;
  auVar24._12_4_ = fVar62 * fVar92;
  auVar24._16_4_ = fVar60 * 0.0;
  auVar24._20_4_ = fVar62 * 0.0;
  auVar24._24_4_ = fVar60 * 0.0;
  auVar24._28_4_ = fVar62;
  auVar11 = vfmadd231ps_fma(auVar24,auVar88,auVar172);
  _local_518 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar65));
  fVar60 = auVar232._0_4_;
  fVar62 = auVar232._4_4_;
  auVar25._4_4_ = fVar62 * fVar91;
  auVar25._0_4_ = fVar60 * fVar59;
  auVar25._8_4_ = fVar60 * fVar117;
  auVar25._12_4_ = fVar62 * fVar92;
  auVar25._16_4_ = fVar60 * 0.0;
  auVar25._20_4_ = fVar62 * 0.0;
  auVar25._24_4_ = fVar60 * 0.0;
  auVar25._28_4_ = fVar62;
  auVar232 = vfmadd231ps_fma(auVar25,auVar88,auVar262);
  auVar26._28_4_ = fVar210;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar12._12_4_ * fVar92,
                          CONCAT48(auVar12._8_4_ * fVar117,
                                   CONCAT44(auVar12._4_4_ * fVar91,auVar12._0_4_ * fVar59))));
  auVar9 = vfmadd231ps_fma(auVar26,auVar88,ZEXT1632(auVar9));
  auVar258 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar10._12_4_,
                                                CONCAT48(fVar117 * auVar10._8_4_,
                                                         CONCAT44(fVar91 * auVar10._4_4_,
                                                                  fVar59 * auVar10._0_4_)))),auVar88
                             ,ZEXT1632(auVar258));
  local_4a8._0_4_ = auVar95._0_4_ + auVar237._0_4_;
  local_4a8._4_4_ = auVar95._4_4_ + auVar237._4_4_;
  local_4a8._8_4_ = auVar95._8_4_ + auVar237._8_4_;
  local_4a8._12_4_ = auVar95._12_4_ + auVar237._12_4_;
  local_4a8._16_4_ = auVar237._16_4_ + 0.0;
  local_4a8._20_4_ = auVar237._20_4_ + 0.0;
  local_4a8._24_4_ = auVar237._24_4_ + 0.0;
  local_4a8._28_4_ = 0;
  auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar92,
                                               CONCAT48(auVar11._8_4_ * fVar117,
                                                        CONCAT44(auVar11._4_4_ * fVar91,
                                                                 auVar11._0_4_ * fVar59)))),auVar88,
                            ZEXT1632(auVar12));
  auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar232._12_4_ * fVar92,
                                               CONCAT48(auVar232._8_4_ * fVar117,
                                                        CONCAT44(auVar232._4_4_ * fVar91,
                                                                 auVar232._0_4_ * fVar59)))),auVar88
                            ,ZEXT1632(auVar10));
  auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar12._12_4_,
                                               CONCAT48(fVar117 * auVar12._8_4_,
                                                        CONCAT44(fVar91 * auVar12._4_4_,
                                                                 fVar59 * auVar12._0_4_)))),auVar88,
                            ZEXT1632(auVar9));
  auVar232 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar10._12_4_ * fVar92,
                                                CONCAT48(auVar10._8_4_ * fVar117,
                                                         CONCAT44(auVar10._4_4_ * fVar91,
                                                                  auVar10._0_4_ * fVar59)))),
                             ZEXT1632(auVar258),auVar88);
  auVar88 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar9));
  auVar13 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar258));
  auVar256._0_4_ = fStack_e0 * auVar88._0_4_ * 3.0;
  auVar256._4_4_ = fStack_e0 * auVar88._4_4_ * 3.0;
  auVar256._8_4_ = fStack_e0 * auVar88._8_4_ * 3.0;
  auVar256._12_4_ = fStack_e0 * auVar88._12_4_ * 3.0;
  auVar256._16_4_ = fStack_e0 * auVar88._16_4_ * 3.0;
  auVar256._20_4_ = fStack_e0 * auVar88._20_4_ * 3.0;
  auVar256._24_4_ = fStack_e0 * auVar88._24_4_ * 3.0;
  auVar256._28_4_ = 0;
  local_f8 = fStack_e0 * auVar13._0_4_ * 3.0;
  fStack_f4 = fStack_e0 * auVar13._4_4_ * 3.0;
  auVar27._4_4_ = fStack_f4;
  auVar27._0_4_ = local_f8;
  fStack_f0 = fStack_e0 * auVar13._8_4_ * 3.0;
  auVar27._8_4_ = fStack_f0;
  fStack_ec = fStack_e0 * auVar13._12_4_ * 3.0;
  auVar27._12_4_ = fStack_ec;
  fStack_e8 = fStack_e0 * auVar13._16_4_ * 3.0;
  auVar27._16_4_ = fStack_e8;
  fStack_e4 = fStack_e0 * auVar13._20_4_ * 3.0;
  auVar27._20_4_ = fStack_e4;
  fStack_e0 = fStack_e0 * auVar13._24_4_ * 3.0;
  auVar27._24_4_ = fStack_e0;
  auVar27._28_4_ = 0x40400000;
  _local_2f8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar11));
  local_1d8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar232));
  auVar88 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar95));
  auVar13 = vsubps_avx(ZEXT1632(auVar232),ZEXT1632(auVar65));
  auVar14 = vsubps_avx(_local_2f8,local_368);
  fVar173 = auVar88._0_4_ + auVar14._0_4_;
  fVar186 = auVar88._4_4_ + auVar14._4_4_;
  fVar187 = auVar88._8_4_ + auVar14._8_4_;
  fVar188 = auVar88._12_4_ + auVar14._12_4_;
  fVar139 = auVar88._16_4_ + auVar14._16_4_;
  fVar157 = auVar88._20_4_ + auVar14._20_4_;
  fVar158 = auVar88._24_4_ + auVar14._24_4_;
  auVar15 = vsubps_avx(local_1d8,_local_518);
  auVar89._0_4_ = auVar13._0_4_ + auVar15._0_4_;
  auVar89._4_4_ = auVar13._4_4_ + auVar15._4_4_;
  auVar89._8_4_ = auVar13._8_4_ + auVar15._8_4_;
  auVar89._12_4_ = auVar13._12_4_ + auVar15._12_4_;
  auVar89._16_4_ = auVar13._16_4_ + auVar15._16_4_;
  auVar89._20_4_ = auVar13._20_4_ + auVar15._20_4_;
  auVar89._24_4_ = auVar13._24_4_ + auVar15._24_4_;
  auVar89._28_4_ = auVar13._28_4_ + auVar15._28_4_;
  local_98 = ZEXT1632(auVar65);
  fVar59 = auVar65._0_4_;
  local_118 = (float)local_318._0_4_ + fVar59;
  fVar91 = auVar65._4_4_;
  fStack_114 = (float)local_318._4_4_ + fVar91;
  fVar117 = auVar65._8_4_;
  fStack_110 = fStack_310 + fVar117;
  fVar92 = auVar65._12_4_;
  fStack_10c = fStack_30c + fVar92;
  fStack_108 = fStack_308 + 0.0;
  fStack_104 = fStack_304 + 0.0;
  fStack_100 = fStack_300 + 0.0;
  local_1f8 = ZEXT1632(auVar95);
  auVar13 = vsubps_avx(local_1f8,auVar237);
  local_78 = vpermps_avx2(_DAT_01fec480,auVar13);
  auVar13 = vsubps_avx(local_98,_local_318);
  local_138 = vpermps_avx2(_DAT_01fec480,auVar13);
  local_b8._0_4_ = auVar11._0_4_ + auVar256._0_4_;
  local_b8._4_4_ = auVar11._4_4_ + auVar256._4_4_;
  local_b8._8_4_ = auVar11._8_4_ + auVar256._8_4_;
  local_b8._12_4_ = auVar11._12_4_ + auVar256._12_4_;
  local_b8._16_4_ = auVar256._16_4_ + 0.0;
  local_b8._20_4_ = auVar256._20_4_ + 0.0;
  local_b8._24_4_ = auVar256._24_4_ + 0.0;
  local_b8._28_4_ = 0;
  auVar209 = ZEXT3264(local_b8);
  auVar238 = ZEXT1632(auVar11);
  auVar13 = vsubps_avx(auVar238,auVar256);
  auVar16 = vpermps_avx2(_DAT_01fec480,auVar13);
  fVar60 = auVar232._0_4_;
  local_f8 = fVar60 + local_f8;
  fVar62 = auVar232._4_4_;
  fStack_f4 = fVar62 + fStack_f4;
  fVar140 = auVar232._8_4_;
  fStack_f0 = fVar140 + fStack_f0;
  fVar210 = auVar232._12_4_;
  fStack_ec = fVar210 + fStack_ec;
  fStack_e8 = fStack_e8 + 0.0;
  fStack_e4 = fStack_e4 + 0.0;
  fStack_e0 = fStack_e0 + 0.0;
  auVar13 = vsubps_avx(ZEXT1632(auVar232),auVar27);
  local_d8 = vpermps_avx2(_DAT_01fec480,auVar13);
  auVar28._4_4_ = fVar91 * fVar186;
  auVar28._0_4_ = fVar59 * fVar173;
  auVar28._8_4_ = fVar117 * fVar187;
  auVar28._12_4_ = fVar92 * fVar188;
  auVar28._16_4_ = fVar139 * 0.0;
  auVar28._20_4_ = fVar157 * 0.0;
  auVar28._24_4_ = fVar158 * 0.0;
  auVar28._28_4_ = auVar13._28_4_;
  auVar12 = vfnmadd231ps_fma(auVar28,local_1f8,auVar89);
  fStack_fc = fStack_2fc + 0.0;
  auVar29._4_4_ = fStack_114 * fVar186;
  auVar29._0_4_ = local_118 * fVar173;
  auVar29._8_4_ = fStack_110 * fVar187;
  auVar29._12_4_ = fStack_10c * fVar188;
  auVar29._16_4_ = fStack_108 * fVar139;
  auVar29._20_4_ = fStack_104 * fVar157;
  auVar29._24_4_ = fStack_100 * fVar158;
  auVar29._28_4_ = 0;
  auVar9 = vfnmadd231ps_fma(auVar29,auVar89,local_4a8);
  auVar30._4_4_ = local_138._4_4_ * fVar186;
  auVar30._0_4_ = local_138._0_4_ * fVar173;
  auVar30._8_4_ = local_138._8_4_ * fVar187;
  auVar30._12_4_ = local_138._12_4_ * fVar188;
  auVar30._16_4_ = local_138._16_4_ * fVar139;
  auVar30._20_4_ = local_138._20_4_ * fVar157;
  auVar30._24_4_ = local_138._24_4_ * fVar158;
  auVar30._28_4_ = fStack_2fc + 0.0;
  auVar258 = vfnmadd231ps_fma(auVar30,local_78,auVar89);
  auVar31._4_4_ = (float)local_518._4_4_ * fVar186;
  auVar31._0_4_ = (float)local_518._0_4_ * fVar173;
  auVar31._8_4_ = (float)uStack_510 * fVar187;
  auVar31._12_4_ = uStack_510._4_4_ * fVar188;
  auVar31._16_4_ = (float)uStack_508 * fVar139;
  auVar31._20_4_ = uStack_508._4_4_ * fVar157;
  auVar31._24_4_ = (float)uStack_500 * fVar158;
  auVar31._28_4_ = uStack_500._4_4_;
  auVar10 = vfnmadd231ps_fma(auVar31,local_368,auVar89);
  auVar196._0_4_ = fVar60 * fVar173;
  auVar196._4_4_ = fVar62 * fVar186;
  auVar196._8_4_ = fVar140 * fVar187;
  auVar196._12_4_ = fVar210 * fVar188;
  auVar196._16_4_ = fVar139 * 0.0;
  auVar196._20_4_ = fVar157 * 0.0;
  auVar196._24_4_ = fVar158 * 0.0;
  auVar196._28_4_ = 0;
  auVar11 = vfnmadd231ps_fma(auVar196,auVar238,auVar89);
  uStack_dc = 0x40400000;
  auVar32._4_4_ = fStack_f4 * fVar186;
  auVar32._0_4_ = local_f8 * fVar173;
  auVar32._8_4_ = fStack_f0 * fVar187;
  auVar32._12_4_ = fStack_ec * fVar188;
  auVar32._16_4_ = fStack_e8 * fVar139;
  auVar32._20_4_ = fStack_e4 * fVar157;
  auVar32._24_4_ = fStack_e0 * fVar158;
  auVar32._28_4_ = local_368._28_4_;
  auVar65 = vfnmadd231ps_fma(auVar32,local_b8,auVar89);
  auVar33._4_4_ = local_d8._4_4_ * fVar186;
  auVar33._0_4_ = local_d8._0_4_ * fVar173;
  auVar33._8_4_ = local_d8._8_4_ * fVar187;
  auVar33._12_4_ = local_d8._12_4_ * fVar188;
  auVar33._16_4_ = local_d8._16_4_ * fVar139;
  auVar33._20_4_ = local_d8._20_4_ * fVar157;
  auVar33._24_4_ = local_d8._24_4_ * fVar158;
  auVar33._28_4_ = local_d8._28_4_;
  auVar107 = vfnmadd231ps_fma(auVar33,auVar16,auVar89);
  auVar34._4_4_ = local_1d8._4_4_ * fVar186;
  auVar34._0_4_ = local_1d8._0_4_ * fVar173;
  auVar34._8_4_ = local_1d8._8_4_ * fVar187;
  auVar34._12_4_ = local_1d8._12_4_ * fVar188;
  auVar34._16_4_ = local_1d8._16_4_ * fVar139;
  auVar34._20_4_ = local_1d8._20_4_ * fVar157;
  auVar34._24_4_ = local_1d8._24_4_ * fVar158;
  auVar34._28_4_ = auVar88._28_4_ + auVar14._28_4_;
  auVar226 = vfnmadd231ps_fma(auVar34,_local_2f8,auVar89);
  auVar13 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar9));
  auVar88 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar9));
  auVar14 = vminps_avx(ZEXT1632(auVar258),ZEXT1632(auVar10));
  auVar14 = vminps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(ZEXT1632(auVar258),ZEXT1632(auVar10));
  auVar88 = vmaxps_avx(auVar88,auVar13);
  auVar15 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar65));
  auVar13 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar65));
  auVar8 = vminps_avx(ZEXT1632(auVar107),ZEXT1632(auVar226));
  auVar15 = vminps_avx(auVar15,auVar8);
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar107),ZEXT1632(auVar226));
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(auVar88,auVar13);
  auVar48._4_4_ = fStack_194;
  auVar48._0_4_ = local_198;
  auVar48._8_4_ = fStack_190;
  auVar48._12_4_ = fStack_18c;
  auVar48._16_4_ = fStack_188;
  auVar48._20_4_ = fStack_184;
  auVar48._24_4_ = fStack_180;
  auVar48._28_4_ = fStack_17c;
  auVar88 = vcmpps_avx(auVar15,auVar48,2);
  auVar46._4_4_ = uStack_1b4;
  auVar46._0_4_ = local_1b8;
  auVar46._8_4_ = uStack_1b0;
  auVar46._12_4_ = uStack_1ac;
  auVar46._16_4_ = uStack_1a8;
  auVar46._20_4_ = uStack_1a4;
  auVar46._24_4_ = uStack_1a0;
  auVar46._28_4_ = uStack_19c;
  auVar13 = vcmpps_avx(auVar13,auVar46,5);
  auVar88 = vandps_avx(auVar13,auVar88);
  auVar13 = local_158 & auVar88;
  _local_318 = auVar16;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar13 = vsubps_avx(local_368,local_1f8);
    auVar14 = vsubps_avx(_local_2f8,auVar238);
    fVar186 = auVar13._0_4_ + auVar14._0_4_;
    fVar187 = auVar13._4_4_ + auVar14._4_4_;
    fVar188 = auVar13._8_4_ + auVar14._8_4_;
    fVar139 = auVar13._12_4_ + auVar14._12_4_;
    fVar157 = auVar13._16_4_ + auVar14._16_4_;
    fVar158 = auVar13._20_4_ + auVar14._20_4_;
    fVar247 = auVar13._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(_local_518,local_98);
    auVar8 = vsubps_avx(local_1d8,ZEXT1632(auVar232));
    auVar106._0_4_ = auVar15._0_4_ + auVar8._0_4_;
    auVar106._4_4_ = auVar15._4_4_ + auVar8._4_4_;
    auVar106._8_4_ = auVar15._8_4_ + auVar8._8_4_;
    auVar106._12_4_ = auVar15._12_4_ + auVar8._12_4_;
    auVar106._16_4_ = auVar15._16_4_ + auVar8._16_4_;
    auVar106._20_4_ = auVar15._20_4_ + auVar8._20_4_;
    auVar106._24_4_ = auVar15._24_4_ + auVar8._24_4_;
    fVar173 = auVar8._28_4_;
    auVar106._28_4_ = auVar15._28_4_ + fVar173;
    auVar35._4_4_ = fVar91 * fVar187;
    auVar35._0_4_ = fVar59 * fVar186;
    auVar35._8_4_ = fVar117 * fVar188;
    auVar35._12_4_ = fVar92 * fVar139;
    auVar35._16_4_ = fVar157 * 0.0;
    auVar35._20_4_ = fVar158 * 0.0;
    auVar35._24_4_ = fVar247 * 0.0;
    auVar35._28_4_ = local_2f8._28_4_;
    auVar11 = vfnmadd231ps_fma(auVar35,auVar106,local_1f8);
    auVar36._4_4_ = fVar187 * fStack_114;
    auVar36._0_4_ = fVar186 * local_118;
    auVar36._8_4_ = fVar188 * fStack_110;
    auVar36._12_4_ = fVar139 * fStack_10c;
    auVar36._16_4_ = fVar157 * fStack_108;
    auVar36._20_4_ = fVar158 * fStack_104;
    auVar36._24_4_ = fVar247 * fStack_100;
    auVar36._28_4_ = 0;
    auVar12 = vfnmadd213ps_fma(local_4a8,auVar106,auVar36);
    auVar37._4_4_ = fVar187 * local_138._4_4_;
    auVar37._0_4_ = fVar186 * local_138._0_4_;
    auVar37._8_4_ = fVar188 * local_138._8_4_;
    auVar37._12_4_ = fVar139 * local_138._12_4_;
    auVar37._16_4_ = fVar157 * local_138._16_4_;
    auVar37._20_4_ = fVar158 * local_138._20_4_;
    auVar37._24_4_ = fVar247 * local_138._24_4_;
    auVar37._28_4_ = 0;
    auVar9 = vfnmadd213ps_fma(local_78,auVar106,auVar37);
    auVar38._4_4_ = (float)local_518._4_4_ * fVar187;
    auVar38._0_4_ = (float)local_518._0_4_ * fVar186;
    auVar38._8_4_ = (float)uStack_510 * fVar188;
    auVar38._12_4_ = uStack_510._4_4_ * fVar139;
    auVar38._16_4_ = (float)uStack_508 * fVar157;
    auVar38._20_4_ = uStack_508._4_4_ * fVar158;
    auVar38._24_4_ = (float)uStack_500 * fVar247;
    auVar38._28_4_ = 0;
    auVar232 = vfnmadd231ps_fma(auVar38,auVar106,local_368);
    auVar126._0_4_ = fVar60 * fVar186;
    auVar126._4_4_ = fVar62 * fVar187;
    auVar126._8_4_ = fVar140 * fVar188;
    auVar126._12_4_ = fVar210 * fVar139;
    auVar126._16_4_ = fVar157 * 0.0;
    auVar126._20_4_ = fVar158 * 0.0;
    auVar126._24_4_ = fVar247 * 0.0;
    auVar126._28_4_ = 0;
    auVar65 = vfnmadd231ps_fma(auVar126,auVar106,auVar238);
    auVar39._4_4_ = fVar187 * fStack_f4;
    auVar39._0_4_ = fVar186 * local_f8;
    auVar39._8_4_ = fVar188 * fStack_f0;
    auVar39._12_4_ = fVar139 * fStack_ec;
    auVar39._16_4_ = fVar157 * fStack_e8;
    auVar39._20_4_ = fVar158 * fStack_e4;
    auVar39._24_4_ = fVar247 * fStack_e0;
    auVar39._28_4_ = fVar173;
    auVar258 = vfnmadd213ps_fma(local_b8,auVar106,auVar39);
    auVar40._4_4_ = fVar187 * local_d8._4_4_;
    auVar40._0_4_ = fVar186 * local_d8._0_4_;
    auVar40._8_4_ = fVar188 * local_d8._8_4_;
    auVar40._12_4_ = fVar139 * local_d8._12_4_;
    auVar40._16_4_ = fVar157 * local_d8._16_4_;
    auVar40._20_4_ = fVar158 * local_d8._20_4_;
    auVar40._24_4_ = fVar247 * local_d8._24_4_;
    auVar40._28_4_ = fVar173;
    auVar10 = vfnmadd213ps_fma(auVar16,auVar106,auVar40);
    auVar209 = ZEXT1664(auVar10);
    auVar41._4_4_ = local_1d8._4_4_ * fVar187;
    auVar41._0_4_ = local_1d8._0_4_ * fVar186;
    auVar41._8_4_ = local_1d8._8_4_ * fVar188;
    auVar41._12_4_ = local_1d8._12_4_ * fVar139;
    auVar41._16_4_ = local_1d8._16_4_ * fVar157;
    auVar41._20_4_ = local_1d8._20_4_ * fVar158;
    auVar41._24_4_ = local_1d8._24_4_ * fVar247;
    auVar41._28_4_ = auVar13._28_4_ + auVar14._28_4_;
    auVar107 = vfnmadd231ps_fma(auVar41,_local_2f8,auVar106);
    auVar14 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
    auVar13 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
    auVar15 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar232));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar232));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar8 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar258));
    auVar14 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar258));
    auVar16 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar107));
    auVar8 = vminps_avx(auVar8,auVar16);
    auVar8 = vminps_avx(auVar15,auVar8);
    auVar15 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar107));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar13,auVar14);
    auVar49._4_4_ = fStack_194;
    auVar49._0_4_ = local_198;
    auVar49._8_4_ = fStack_190;
    auVar49._12_4_ = fStack_18c;
    auVar49._16_4_ = fStack_188;
    auVar49._20_4_ = fStack_184;
    auVar49._24_4_ = fStack_180;
    auVar49._28_4_ = fStack_17c;
    auVar13 = vcmpps_avx(auVar8,auVar49,2);
    auVar47._4_4_ = uStack_1b4;
    auVar47._0_4_ = local_1b8;
    auVar47._8_4_ = uStack_1b0;
    auVar47._12_4_ = uStack_1ac;
    auVar47._16_4_ = uStack_1a8;
    auVar47._20_4_ = uStack_1a4;
    auVar47._24_4_ = uStack_1a0;
    auVar47._28_4_ = uStack_19c;
    auVar14 = vcmpps_avx(auVar14,auVar47,5);
    auVar13 = vandps_avx(auVar14,auVar13);
    auVar88 = vandps_avx(local_158,auVar88);
    auVar14 = auVar88 & auVar13;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar88 = vandps_avx(auVar13,auVar88);
      uVar55 = vmovmskps_avx(auVar88);
      if (uVar55 != 0) {
        uVar57 = (ulong)uVar50;
        auStack_2d8[uVar57] = uVar55 & 0xff;
        uVar93 = vmovlps_avx(local_248);
        *(undefined8 *)(&uStack_178 + uVar57 * 2) = uVar93;
        uVar51 = vmovlps_avx(auVar76);
        auStack_58[uVar57] = uVar51;
        uVar50 = uVar50 + 1;
      }
    }
  }
LAB_015a6180:
  if (uVar50 != 0) {
    uVar57 = (ulong)(uVar50 - 1);
    uVar54 = auStack_2d8[uVar57];
    uVar55 = (&uStack_178)[uVar57 * 2];
    fVar59 = afStack_174[uVar57 * 2];
    iVar17 = 0;
    for (uVar51 = (ulong)uVar54; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
      iVar17 = iVar17 + 1;
    }
    uVar54 = uVar54 - 1 & uVar54;
    if (uVar54 == 0) {
      uVar50 = uVar50 - 1;
    }
    auVar76._8_8_ = 0;
    auVar76._0_8_ = auStack_58[uVar57];
    auStack_2d8[uVar57] = uVar54;
    fVar91 = (float)(iVar17 + 1) * 0.14285715;
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * (float)iVar17 * 0.14285715)),ZEXT416(uVar55),
                              ZEXT416((uint)(1.0 - (float)iVar17 * 0.14285715)));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar91)),ZEXT416(uVar55),
                             ZEXT416((uint)(1.0 - fVar91)));
    fVar91 = auVar9._0_4_;
    auVar185._0_4_ = auVar12._0_4_;
    fVar59 = fVar91 - auVar185._0_4_;
    if (fVar59 < 0.16666667) {
      auVar258 = vshufps_avx(auVar76,auVar76,0x50);
      auVar97._8_4_ = 0x3f800000;
      auVar97._0_8_ = 0x3f8000003f800000;
      auVar97._12_4_ = 0x3f800000;
      auVar10 = vsubps_avx(auVar97,auVar258);
      fVar117 = auVar258._0_4_;
      auVar133._0_4_ = fVar117 * (float)local_3c8._0_4_;
      fVar92 = auVar258._4_4_;
      auVar133._4_4_ = fVar92 * (float)local_3c8._4_4_;
      fVar60 = auVar258._8_4_;
      auVar133._8_4_ = fVar60 * fStack_3c0;
      fVar62 = auVar258._12_4_;
      auVar133._12_4_ = fVar62 * fStack_3bc;
      auVar148._0_4_ = fVar159 * fVar117;
      auVar148._4_4_ = fVar239 * fVar92;
      auVar148._8_4_ = fVar159 * fVar60;
      auVar148._12_4_ = fVar239 * fVar62;
      auVar169._0_4_ = fVar117 * (float)local_3d8._0_4_;
      auVar169._4_4_ = fVar92 * (float)local_3d8._4_4_;
      auVar169._8_4_ = fVar60 * fStack_3d0;
      auVar169._12_4_ = fVar62 * fStack_3cc;
      auVar78._0_4_ = fVar117 * (float)local_3e8._0_4_;
      auVar78._4_4_ = fVar92 * (float)local_3e8._4_4_;
      auVar78._8_4_ = fVar60 * fStack_3e0;
      auVar78._12_4_ = fVar62 * fStack_3dc;
      auVar258 = vfmadd231ps_fma(auVar133,auVar10,local_388);
      auVar11 = vfmadd231ps_fma(auVar148,auVar10,local_398);
      auVar232 = vfmadd231ps_fma(auVar169,auVar10,local_3a8);
      auVar10 = vfmadd231ps_fma(auVar78,auVar10,local_3b8);
      auVar127._16_16_ = auVar258;
      auVar127._0_16_ = auVar258;
      auVar138._16_16_ = auVar11;
      auVar138._0_16_ = auVar11;
      auVar156._16_16_ = auVar232;
      auVar156._0_16_ = auVar232;
      _local_518 = auVar12;
      auVar185._4_4_ = auVar185._0_4_;
      auVar185._8_4_ = auVar185._0_4_;
      auVar185._12_4_ = auVar185._0_4_;
      local_4a8._0_16_ = auVar9;
      auVar185._20_4_ = fVar91;
      auVar185._16_4_ = fVar91;
      auVar185._24_4_ = fVar91;
      auVar185._28_4_ = fVar91;
      auVar88 = vsubps_avx(auVar138,auVar127);
      auVar11 = vfmadd213ps_fma(auVar88,auVar185,auVar127);
      auVar88 = vsubps_avx(auVar156,auVar138);
      auVar65 = vfmadd213ps_fma(auVar88,auVar185,auVar138);
      auVar258 = vsubps_avx(auVar10,auVar232);
      auVar90._16_16_ = auVar258;
      auVar90._0_16_ = auVar258;
      auVar258 = vfmadd213ps_fma(auVar90,auVar185,auVar156);
      auVar88 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar11));
      auVar10 = vfmadd213ps_fma(auVar88,auVar185,ZEXT1632(auVar11));
      auVar88 = vsubps_avx(ZEXT1632(auVar258),ZEXT1632(auVar65));
      auVar258 = vfmadd213ps_fma(auVar88,auVar185,ZEXT1632(auVar65));
      auVar88 = vsubps_avx(ZEXT1632(auVar258),ZEXT1632(auVar10));
      auVar64 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar88,auVar185);
      fVar210 = auVar88._4_4_ * 3.0;
      local_368._0_4_ = fVar59;
      fVar117 = fVar59 * 0.33333334;
      local_1d8._0_8_ =
           CONCAT44(auVar64._4_4_ + fVar117 * fVar210,auVar64._0_4_ + fVar117 * auVar88._0_4_ * 3.0)
      ;
      local_1d8._8_4_ = auVar64._8_4_ + fVar117 * auVar88._8_4_ * 3.0;
      local_1d8._12_4_ = auVar64._12_4_ + fVar117 * auVar88._12_4_ * 3.0;
      auVar10 = vshufpd_avx(auVar64,auVar64,3);
      auVar11 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_318 = auVar10;
      auVar258 = vsubps_avx(auVar10,auVar64);
      _local_2f8 = auVar11;
      auVar232 = vsubps_avx(auVar11,(undefined1  [16])0x0);
      auVar79._0_4_ = auVar258._0_4_ + auVar232._0_4_;
      auVar79._4_4_ = auVar258._4_4_ + auVar232._4_4_;
      auVar79._8_4_ = auVar258._8_4_ + auVar232._8_4_;
      auVar79._12_4_ = auVar258._12_4_ + auVar232._12_4_;
      auVar258 = vshufps_avx(auVar64,auVar64,0xb1);
      auVar232 = vshufps_avx(local_1d8._0_16_,local_1d8._0_16_,0xb1);
      auVar252._4_4_ = auVar79._0_4_;
      auVar252._0_4_ = auVar79._0_4_;
      auVar252._8_4_ = auVar79._0_4_;
      auVar252._12_4_ = auVar79._0_4_;
      auVar65 = vshufps_avx(auVar79,auVar79,0x55);
      fVar92 = auVar65._0_4_;
      auVar80._0_4_ = fVar92 * auVar258._0_4_;
      fVar60 = auVar65._4_4_;
      auVar80._4_4_ = fVar60 * auVar258._4_4_;
      fVar62 = auVar65._8_4_;
      auVar80._8_4_ = fVar62 * auVar258._8_4_;
      fVar140 = auVar65._12_4_;
      auVar80._12_4_ = fVar140 * auVar258._12_4_;
      auVar149._0_4_ = fVar92 * auVar232._0_4_;
      auVar149._4_4_ = fVar60 * auVar232._4_4_;
      auVar149._8_4_ = fVar62 * auVar232._8_4_;
      auVar149._12_4_ = fVar140 * auVar232._12_4_;
      auVar107 = vfmadd231ps_fma(auVar80,auVar252,auVar64);
      auVar226 = vfmadd231ps_fma(auVar149,auVar252,local_1d8._0_16_);
      auVar232 = vshufps_avx(auVar107,auVar107,0xe8);
      auVar65 = vshufps_avx(auVar226,auVar226,0xe8);
      auVar258 = vcmpps_avx(auVar232,auVar65,1);
      uVar55 = vextractps_avx(auVar258,0);
      auVar95 = auVar226;
      if ((uVar55 & 1) == 0) {
        auVar95 = auVar107;
      }
      auVar119._0_4_ = fVar117 * auVar88._16_4_ * 3.0;
      auVar119._4_4_ = fVar117 * fVar210;
      auVar119._8_4_ = fVar117 * auVar88._24_4_ * 3.0;
      auVar119._12_4_ = fVar117 * auVar209._28_4_;
      local_1f8._0_16_ = vsubps_avx((undefined1  [16])0x0,auVar119);
      auVar120 = vshufps_avx(local_1f8._0_16_,local_1f8._0_16_,0xb1);
      auVar129 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar177._0_4_ = fVar92 * auVar120._0_4_;
      auVar177._4_4_ = fVar60 * auVar120._4_4_;
      auVar177._8_4_ = fVar62 * auVar120._8_4_;
      auVar177._12_4_ = fVar140 * auVar120._12_4_;
      auVar192._0_4_ = auVar129._0_4_ * fVar92;
      auVar192._4_4_ = auVar129._4_4_ * fVar60;
      auVar192._8_4_ = auVar129._8_4_ * fVar62;
      auVar192._12_4_ = auVar129._12_4_ * fVar140;
      auVar94 = vfmadd231ps_fma(auVar177,auVar252,local_1f8._0_16_);
      auVar128 = vfmadd231ps_fma(auVar192,(undefined1  [16])0x0,auVar252);
      auVar129 = vshufps_avx(auVar94,auVar94,0xe8);
      auVar63 = vshufps_avx(auVar128,auVar128,0xe8);
      auVar209 = ZEXT1664(auVar63);
      auVar120 = vcmpps_avx(auVar129,auVar63,1);
      uVar55 = vextractps_avx(auVar120,0);
      auVar141 = auVar128;
      if ((uVar55 & 1) == 0) {
        auVar141 = auVar94;
      }
      auVar95 = vmaxss_avx(auVar141,auVar95);
      auVar232 = vminps_avx(auVar232,auVar65);
      auVar65 = vminps_avx(auVar129,auVar63);
      auVar65 = vminps_avx(auVar232,auVar65);
      auVar258 = vshufps_avx(auVar258,auVar258,0x55);
      auVar258 = vblendps_avx(auVar258,auVar120,2);
      auVar120 = vpslld_avx(auVar258,0x1f);
      auVar258 = vshufpd_avx(auVar226,auVar226,1);
      auVar258 = vinsertps_avx(auVar258,auVar128,0x9c);
      auVar232 = vshufpd_avx(auVar107,auVar107,1);
      auVar232 = vinsertps_avx(auVar232,auVar94,0x9c);
      auVar258 = vblendvps_avx(auVar232,auVar258,auVar120);
      auVar232 = vmovshdup_avx(auVar258);
      auVar258 = vmaxss_avx(auVar232,auVar258);
      fVar62 = auVar65._0_4_;
      auVar232 = vmovshdup_avx(auVar65);
      fVar60 = auVar258._0_4_;
      fVar117 = auVar232._0_4_;
      fVar92 = auVar95._0_4_;
      if (((0.0001 <= fVar62) || (fVar60 <= -0.0001)) && (0.0001 <= fVar117 || fVar60 <= -0.0001))
      goto code_r0x015a6494;
      goto LAB_015a64ba;
    }
    local_248 = vinsertps_avx(auVar12,auVar9,0x10);
    goto LAB_015a5c06;
  }
  if (bVar56) {
    return bVar56;
  }
  fVar59 = ray->tfar;
  auVar87._4_4_ = fVar59;
  auVar87._0_4_ = fVar59;
  auVar87._8_4_ = fVar59;
  auVar87._12_4_ = fVar59;
  auVar12 = vcmpps_avx(local_258,auVar87,2);
  uVar50 = vmovmskps_avx(auVar12);
  uVar50 = (uint)uVar58 & uVar50;
  if (uVar50 == 0) {
    return bVar56;
  }
  goto LAB_015a54b1;
code_r0x015a6494:
  auVar232 = vcmpps_avx(auVar232,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar107 = vcmpps_avx(auVar65,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar232 = vandps_avx(auVar107,auVar232);
  if (fVar92 <= -0.0001 || (auVar232 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_015a6180;
LAB_015a64ba:
  auVar107 = vcmpps_avx(auVar65,_DAT_01f7aa10,1);
  auVar226 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar232 = vcmpss_avx(auVar95,ZEXT816(0) << 0x20,1);
  auVar109._8_4_ = 0xbf800000;
  auVar109._0_8_ = 0xbf800000bf800000;
  auVar109._12_4_ = 0xbf800000;
  auVar232 = vblendvps_avx(auVar97,auVar109,auVar232);
  auVar107 = vblendvps_avx(auVar97,auVar109,auVar107);
  fVar210 = auVar107._0_4_;
  fVar140 = auVar232._0_4_;
  auVar232 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar210 == fVar140) && (!NAN(fVar210) && !NAN(fVar140))) {
    auVar232 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar210 == fVar140) && (!NAN(fVar210) && !NAN(fVar140))) {
    auVar226 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar107 = vmovshdup_avx(auVar107);
  fVar173 = auVar107._0_4_;
  if ((fVar210 != fVar173) || (NAN(fVar210) || NAN(fVar173))) {
    auVar178._12_4_ = 0;
    auVar178._0_12_ = ZEXT812(0);
    auVar178 = auVar178 << 0x20;
    if ((fVar117 != fVar62) || (NAN(fVar117) || NAN(fVar62))) {
      auVar121._0_4_ = (float)((uint)fVar62 ^ local_408);
      auVar121._4_4_ = auVar65._4_4_ ^ uStack_404;
      auVar121._8_4_ = auVar65._8_4_ ^ uStack_400;
      auVar121._12_4_ = auVar65._12_4_ ^ uStack_3fc;
      auVar122._0_4_ = auVar121._0_4_ / (fVar117 - fVar62);
      auVar122._4_12_ = auVar121._4_12_;
      auVar65 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar122._0_4_)),auVar178,auVar122);
      auVar107 = auVar65;
    }
    else {
      auVar65 = ZEXT816(0) << 0x20;
      if ((fVar62 != 0.0) || (auVar107 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar62))) {
        auVar65 = SUB6416(ZEXT464(0x7f800000),0);
        auVar107 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar232 = vminss_avx(auVar232,auVar65);
    auVar226 = vmaxss_avx(auVar107,auVar226);
  }
  else {
    auVar42._12_4_ = 0;
    auVar42._0_12_ = ZEXT812(0);
    auVar178 = auVar42 << 0x20;
  }
  auVar258 = vcmpss_avx(auVar258,auVar178,1);
  auVar110._8_4_ = 0xbf800000;
  auVar110._0_8_ = 0xbf800000bf800000;
  auVar110._12_4_ = 0xbf800000;
  auVar258 = vblendvps_avx(auVar97,auVar110,auVar258);
  fVar117 = auVar258._0_4_;
  auVar258 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar140 != fVar117) || (NAN(fVar140) || NAN(fVar117))) {
    if ((fVar60 != fVar92) || (NAN(fVar60) || NAN(fVar92))) {
      auVar81._0_4_ = (float)((uint)fVar92 ^ local_408);
      auVar81._4_4_ = auVar95._4_4_ ^ uStack_404;
      auVar81._8_4_ = auVar95._8_4_ ^ uStack_400;
      auVar81._12_4_ = auVar95._12_4_ ^ uStack_3fc;
      auVar123._0_4_ = auVar81._0_4_ / (fVar60 - fVar92);
      auVar123._4_12_ = auVar81._4_12_;
      auVar65 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar123._0_4_)),auVar178,auVar123);
      auVar107 = auVar65;
    }
    else {
      auVar65 = ZEXT816(0) << 0x20;
      if ((fVar92 != 0.0) || (auVar107 = auVar258, NAN(fVar92))) {
        auVar65 = SUB6416(ZEXT464(0x7f800000),0);
        auVar107 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar232 = vminss_avx(auVar232,auVar65);
    auVar226 = vmaxss_avx(auVar107,auVar226);
  }
  if ((fVar173 != fVar117) || (NAN(fVar173) || NAN(fVar117))) {
    auVar232 = vminss_avx(auVar232,auVar258);
    auVar226 = vmaxss_avx(auVar258,auVar226);
  }
  auVar232 = vmaxss_avx(auVar178,auVar232);
  auVar65 = vminss_avx(auVar226,auVar258);
  if (auVar65._0_4_ < auVar232._0_4_) goto LAB_015a6180;
  auVar232 = vmaxss_avx(auVar178,ZEXT416((uint)(auVar232._0_4_ + -0.1)));
  auVar258 = vminss_avx(ZEXT416((uint)(auVar65._0_4_ + 0.1)),auVar258);
  auVar134._0_8_ = auVar64._0_8_;
  auVar134._8_8_ = auVar134._0_8_;
  auVar201._8_8_ = local_1d8._0_8_;
  auVar201._0_8_ = local_1d8._0_8_;
  auVar215._8_8_ = local_1f8._0_8_;
  auVar215._0_8_ = local_1f8._0_8_;
  auVar65 = vshufpd_avx(local_1d8._0_16_,local_1d8._0_16_,3);
  auVar107 = vshufpd_avx(local_1f8._0_16_,local_1f8._0_16_,3);
  auVar226 = vshufps_avx(auVar232,auVar258,0);
  auVar64 = vsubps_avx(auVar97,auVar226);
  local_318._0_4_ = auVar10._0_4_;
  local_318._4_4_ = auVar10._4_4_;
  fStack_310 = auVar10._8_4_;
  fStack_30c = auVar10._12_4_;
  fVar117 = auVar226._0_4_;
  auVar82._0_4_ = fVar117 * (float)local_318._0_4_;
  fVar92 = auVar226._4_4_;
  auVar82._4_4_ = fVar92 * (float)local_318._4_4_;
  fVar60 = auVar226._8_4_;
  auVar82._8_4_ = fVar60 * fStack_310;
  fVar62 = auVar226._12_4_;
  auVar82._12_4_ = fVar62 * fStack_30c;
  auVar170._0_4_ = fVar117 * auVar65._0_4_;
  auVar170._4_4_ = fVar92 * auVar65._4_4_;
  auVar170._8_4_ = fVar60 * auVar65._8_4_;
  auVar170._12_4_ = fVar62 * auVar65._12_4_;
  auVar179._0_4_ = fVar117 * auVar107._0_4_;
  auVar179._4_4_ = fVar92 * auVar107._4_4_;
  auVar179._8_4_ = fVar60 * auVar107._8_4_;
  auVar179._12_4_ = fVar62 * auVar107._12_4_;
  local_2f8._0_4_ = auVar11._0_4_;
  local_2f8._4_4_ = auVar11._4_4_;
  fStack_2f0 = auVar11._8_4_;
  fStack_2ec = auVar11._12_4_;
  auVar193._0_4_ = fVar117 * (float)local_2f8._0_4_;
  auVar193._4_4_ = fVar92 * (float)local_2f8._4_4_;
  auVar193._8_4_ = fVar60 * fStack_2f0;
  auVar193._12_4_ = fVar62 * fStack_2ec;
  auVar65 = vfmadd231ps_fma(auVar82,auVar64,auVar134);
  auVar107 = vfmadd231ps_fma(auVar170,auVar64,auVar201);
  auVar226 = vfmadd231ps_fma(auVar179,auVar64,auVar215);
  auVar64 = vfmadd231ps_fma(auVar193,auVar64,ZEXT816(0));
  auVar10 = vmovshdup_avx(auVar76);
  auVar94 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar232._0_4_)),auVar76,
                            ZEXT416((uint)(1.0 - auVar232._0_4_)));
  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar258._0_4_)),auVar76,
                             ZEXT416((uint)(1.0 - auVar258._0_4_)));
  fVar117 = 1.0 / fVar59;
  auVar258 = vsubps_avx(auVar107,auVar65);
  auVar202._0_4_ = auVar258._0_4_ * 3.0;
  auVar202._4_4_ = auVar258._4_4_ * 3.0;
  auVar202._8_4_ = auVar258._8_4_ * 3.0;
  auVar202._12_4_ = auVar258._12_4_ * 3.0;
  auVar258 = vsubps_avx(auVar226,auVar107);
  auVar216._0_4_ = auVar258._0_4_ * 3.0;
  auVar216._4_4_ = auVar258._4_4_ * 3.0;
  auVar216._8_4_ = auVar258._8_4_ * 3.0;
  auVar216._12_4_ = auVar258._12_4_ * 3.0;
  auVar258 = vsubps_avx(auVar64,auVar226);
  auVar227._0_4_ = auVar258._0_4_ * 3.0;
  auVar227._4_4_ = auVar258._4_4_ * 3.0;
  auVar227._8_4_ = auVar258._8_4_ * 3.0;
  auVar227._12_4_ = auVar258._12_4_ * 3.0;
  auVar10 = vminps_avx(auVar216,auVar227);
  auVar258 = vmaxps_avx(auVar216,auVar227);
  auVar10 = vminps_avx(auVar202,auVar10);
  auVar258 = vmaxps_avx(auVar202,auVar258);
  auVar11 = vshufpd_avx(auVar10,auVar10,3);
  auVar232 = vshufpd_avx(auVar258,auVar258,3);
  auVar10 = vminps_avx(auVar10,auVar11);
  auVar258 = vmaxps_avx(auVar258,auVar232);
  auVar217._0_4_ = auVar10._0_4_ * fVar117;
  auVar217._4_4_ = auVar10._4_4_ * fVar117;
  auVar217._8_4_ = auVar10._8_4_ * fVar117;
  auVar217._12_4_ = auVar10._12_4_ * fVar117;
  auVar203._0_4_ = auVar258._0_4_ * fVar117;
  auVar203._4_4_ = auVar258._4_4_ * fVar117;
  auVar203._8_4_ = auVar258._8_4_ * fVar117;
  auVar203._12_4_ = auVar258._12_4_ * fVar117;
  fVar117 = 1.0 / (auVar128._0_4_ - auVar94._0_4_);
  auVar258 = vshufpd_avx(auVar65,auVar65,3);
  auVar10 = vshufpd_avx(auVar107,auVar107,3);
  auVar11 = vshufpd_avx(auVar226,auVar226,3);
  auVar232 = vshufpd_avx(auVar64,auVar64,3);
  auVar258 = vsubps_avx(auVar258,auVar65);
  auVar65 = vsubps_avx(auVar10,auVar107);
  auVar107 = vsubps_avx(auVar11,auVar226);
  auVar232 = vsubps_avx(auVar232,auVar64);
  auVar10 = vminps_avx(auVar258,auVar65);
  auVar258 = vmaxps_avx(auVar258,auVar65);
  auVar11 = vminps_avx(auVar107,auVar232);
  auVar11 = vminps_avx(auVar10,auVar11);
  auVar10 = vmaxps_avx(auVar107,auVar232);
  auVar258 = vmaxps_avx(auVar258,auVar10);
  auVar241._0_4_ = fVar117 * auVar11._0_4_;
  auVar241._4_4_ = fVar117 * auVar11._4_4_;
  auVar241._8_4_ = fVar117 * auVar11._8_4_;
  auVar241._12_4_ = fVar117 * auVar11._12_4_;
  auVar233._0_4_ = fVar117 * auVar258._0_4_;
  auVar233._4_4_ = fVar117 * auVar258._4_4_;
  auVar233._8_4_ = fVar117 * auVar258._8_4_;
  auVar233._12_4_ = fVar117 * auVar258._12_4_;
  auVar232 = vinsertps_avx(auVar12,auVar94,0x10);
  auVar65 = vinsertps_avx(auVar9,auVar128,0x10);
  auVar228._0_4_ = (auVar232._0_4_ + auVar65._0_4_) * 0.5;
  auVar228._4_4_ = (auVar232._4_4_ + auVar65._4_4_) * 0.5;
  auVar228._8_4_ = (auVar232._8_4_ + auVar65._8_4_) * 0.5;
  auVar228._12_4_ = (auVar232._12_4_ + auVar65._12_4_) * 0.5;
  auVar83._4_4_ = auVar228._0_4_;
  auVar83._0_4_ = auVar228._0_4_;
  auVar83._8_4_ = auVar228._0_4_;
  auVar83._12_4_ = auVar228._0_4_;
  auVar258 = vfmadd213ps_fma(local_208,auVar83,local_488);
  auVar10 = vfmadd213ps_fma(local_218,auVar83,local_4e8);
  auVar11 = vfmadd213ps_fma(local_228,auVar83,local_4f8);
  auVar9 = vsubps_avx(auVar10,auVar258);
  auVar258 = vfmadd213ps_fma(auVar9,auVar83,auVar258);
  auVar9 = vsubps_avx(auVar11,auVar10);
  auVar9 = vfmadd213ps_fma(auVar9,auVar83,auVar10);
  auVar9 = vsubps_avx(auVar9,auVar258);
  auVar258 = vfmadd231ps_fma(auVar258,auVar9,auVar83);
  auVar84._0_8_ = CONCAT44(auVar9._4_4_ * 3.0,auVar9._0_4_ * 3.0);
  auVar84._8_4_ = auVar9._8_4_ * 3.0;
  auVar84._12_4_ = auVar9._12_4_ * 3.0;
  auVar253._8_8_ = auVar258._0_8_;
  auVar253._0_8_ = auVar258._0_8_;
  auVar9 = vshufpd_avx(auVar258,auVar258,3);
  auVar258 = vshufps_avx(auVar228,auVar228,0x55);
  auVar226 = vsubps_avx(auVar9,auVar253);
  auVar95 = vfmadd231ps_fma(auVar253,auVar258,auVar226);
  auVar259._8_8_ = auVar84._0_8_;
  auVar259._0_8_ = auVar84._0_8_;
  auVar9 = vshufpd_avx(auVar84,auVar84,3);
  auVar9 = vsubps_avx(auVar9,auVar259);
  auVar64 = vfmadd213ps_fma(auVar9,auVar258,auVar259);
  auVar258 = vmovshdup_avx(auVar64);
  auVar260._0_8_ = auVar258._0_8_ ^ 0x8000000080000000;
  auVar260._8_4_ = auVar258._8_4_ ^ 0x80000000;
  auVar260._12_4_ = auVar258._12_4_ ^ 0x80000000;
  auVar10 = vmovshdup_avx(auVar226);
  auVar9 = vunpcklps_avx(auVar10,auVar260);
  auVar11 = vshufps_avx(auVar9,auVar260,4);
  auVar107 = vshufps_avx(auVar228,auVar228,0x54);
  auVar124._0_8_ = auVar226._0_8_ ^ 0x8000000080000000;
  auVar124._8_4_ = auVar226._8_4_ ^ 0x80000000;
  auVar124._12_4_ = auVar226._12_4_ ^ 0x80000000;
  auVar9 = vmovlhps_avx(auVar124,auVar64);
  auVar9 = vshufps_avx(auVar9,auVar64,8);
  auVar258 = vfmsub231ss_fma(ZEXT416((uint)(auVar226._0_4_ * auVar258._0_4_)),auVar10,auVar64);
  uVar61 = auVar258._0_4_;
  auVar85._4_4_ = uVar61;
  auVar85._0_4_ = uVar61;
  auVar85._8_4_ = uVar61;
  auVar85._12_4_ = uVar61;
  auVar258 = vdivps_avx(auVar11,auVar85);
  auVar10 = vdivps_avx(auVar9,auVar85);
  fVar60 = auVar95._0_4_;
  fVar117 = auVar258._0_4_;
  auVar9 = vshufps_avx(auVar95,auVar95,0x55);
  fVar92 = auVar10._0_4_;
  auVar86._0_4_ = fVar60 * fVar117 + auVar9._0_4_ * fVar92;
  auVar86._4_4_ = fVar60 * auVar258._4_4_ + auVar9._4_4_ * auVar10._4_4_;
  auVar86._8_4_ = fVar60 * auVar258._8_4_ + auVar9._8_4_ * auVar10._8_4_;
  auVar86._12_4_ = fVar60 * auVar258._12_4_ + auVar9._12_4_ * auVar10._12_4_;
  auVar63 = vsubps_avx(auVar107,auVar86);
  auVar107 = vmovshdup_avx(auVar258);
  auVar9 = vinsertps_avx(auVar217,auVar241,0x1c);
  auVar150._0_4_ = auVar107._0_4_ * auVar9._0_4_;
  auVar150._4_4_ = auVar107._4_4_ * auVar9._4_4_;
  auVar150._8_4_ = auVar107._8_4_ * auVar9._8_4_;
  auVar150._12_4_ = auVar107._12_4_ * auVar9._12_4_;
  auVar11 = vinsertps_avx(auVar203,auVar233,0x1c);
  auVar98._0_4_ = auVar11._0_4_ * auVar107._0_4_;
  auVar98._4_4_ = auVar11._4_4_ * auVar107._4_4_;
  auVar98._8_4_ = auVar11._8_4_ * auVar107._8_4_;
  auVar98._12_4_ = auVar11._12_4_ * auVar107._12_4_;
  auVar95 = vminps_avx(auVar150,auVar98);
  auVar64 = vmaxps_avx(auVar98,auVar150);
  auVar107 = vinsertps_avx(auVar241,auVar217,0x4c);
  auVar120 = vmovshdup_avx(auVar10);
  auVar226 = vinsertps_avx(auVar233,auVar203,0x4c);
  auVar234._0_4_ = auVar120._0_4_ * auVar107._0_4_;
  auVar234._4_4_ = auVar120._4_4_ * auVar107._4_4_;
  auVar234._8_4_ = auVar120._8_4_ * auVar107._8_4_;
  auVar234._12_4_ = auVar120._12_4_ * auVar107._12_4_;
  auVar218._0_4_ = auVar120._0_4_ * auVar226._0_4_;
  auVar218._4_4_ = auVar120._4_4_ * auVar226._4_4_;
  auVar218._8_4_ = auVar120._8_4_ * auVar226._8_4_;
  auVar218._12_4_ = auVar120._12_4_ * auVar226._12_4_;
  auVar120 = vminps_avx(auVar234,auVar218);
  auVar242._0_4_ = auVar95._0_4_ + auVar120._0_4_;
  auVar242._4_4_ = auVar95._4_4_ + auVar120._4_4_;
  auVar242._8_4_ = auVar95._8_4_ + auVar120._8_4_;
  auVar242._12_4_ = auVar95._12_4_ + auVar120._12_4_;
  auVar95 = vmaxps_avx(auVar218,auVar234);
  auVar99._0_4_ = auVar95._0_4_ + auVar64._0_4_;
  auVar99._4_4_ = auVar95._4_4_ + auVar64._4_4_;
  auVar99._8_4_ = auVar95._8_4_ + auVar64._8_4_;
  auVar99._12_4_ = auVar95._12_4_ + auVar64._12_4_;
  auVar219._8_8_ = 0x3f80000000000000;
  auVar219._0_8_ = 0x3f80000000000000;
  auVar64 = vsubps_avx(auVar219,auVar99);
  auVar95 = vsubps_avx(auVar219,auVar242);
  auVar120 = vsubps_avx(auVar232,auVar228);
  auVar129 = vsubps_avx(auVar65,auVar228);
  auVar111._0_4_ = fVar117 * auVar9._0_4_;
  auVar111._4_4_ = fVar117 * auVar9._4_4_;
  auVar111._8_4_ = fVar117 * auVar9._8_4_;
  auVar111._12_4_ = fVar117 * auVar9._12_4_;
  auVar243._0_4_ = fVar117 * auVar11._0_4_;
  auVar243._4_4_ = fVar117 * auVar11._4_4_;
  auVar243._8_4_ = fVar117 * auVar11._8_4_;
  auVar243._12_4_ = fVar117 * auVar11._12_4_;
  auVar11 = vminps_avx(auVar111,auVar243);
  auVar9 = vmaxps_avx(auVar243,auVar111);
  auVar151._0_4_ = fVar92 * auVar107._0_4_;
  auVar151._4_4_ = fVar92 * auVar107._4_4_;
  auVar151._8_4_ = fVar92 * auVar107._8_4_;
  auVar151._12_4_ = fVar92 * auVar107._12_4_;
  auVar204._0_4_ = fVar92 * auVar226._0_4_;
  auVar204._4_4_ = fVar92 * auVar226._4_4_;
  auVar204._8_4_ = fVar92 * auVar226._8_4_;
  auVar204._12_4_ = fVar92 * auVar226._12_4_;
  auVar107 = vminps_avx(auVar151,auVar204);
  auVar244._0_4_ = auVar11._0_4_ + auVar107._0_4_;
  auVar244._4_4_ = auVar11._4_4_ + auVar107._4_4_;
  auVar244._8_4_ = auVar11._8_4_ + auVar107._8_4_;
  auVar244._12_4_ = auVar11._12_4_ + auVar107._12_4_;
  fVar173 = auVar120._0_4_;
  auVar254._0_4_ = fVar173 * auVar64._0_4_;
  fVar186 = auVar120._4_4_;
  auVar254._4_4_ = fVar186 * auVar64._4_4_;
  fVar187 = auVar120._8_4_;
  auVar254._8_4_ = fVar187 * auVar64._8_4_;
  fVar188 = auVar120._12_4_;
  auVar254._12_4_ = fVar188 * auVar64._12_4_;
  auVar11 = vmaxps_avx(auVar204,auVar151);
  auVar205._0_4_ = fVar173 * auVar95._0_4_;
  auVar205._4_4_ = fVar186 * auVar95._4_4_;
  auVar205._8_4_ = fVar187 * auVar95._8_4_;
  auVar205._12_4_ = fVar188 * auVar95._12_4_;
  fVar60 = auVar129._0_4_;
  auVar100._0_4_ = fVar60 * auVar64._0_4_;
  fVar62 = auVar129._4_4_;
  auVar100._4_4_ = fVar62 * auVar64._4_4_;
  fVar140 = auVar129._8_4_;
  auVar100._8_4_ = fVar140 * auVar64._8_4_;
  fVar210 = auVar129._12_4_;
  auVar100._12_4_ = fVar210 * auVar64._12_4_;
  auVar220._0_4_ = fVar60 * auVar95._0_4_;
  auVar220._4_4_ = fVar62 * auVar95._4_4_;
  auVar220._8_4_ = fVar140 * auVar95._8_4_;
  auVar220._12_4_ = fVar210 * auVar95._12_4_;
  auVar112._0_4_ = auVar9._0_4_ + auVar11._0_4_;
  auVar112._4_4_ = auVar9._4_4_ + auVar11._4_4_;
  auVar112._8_4_ = auVar9._8_4_ + auVar11._8_4_;
  auVar112._12_4_ = auVar9._12_4_ + auVar11._12_4_;
  auVar152._8_8_ = 0x3f800000;
  auVar152._0_8_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar152,auVar112);
  auVar11 = vsubps_avx(auVar152,auVar244);
  auVar245._0_4_ = fVar173 * auVar9._0_4_;
  auVar245._4_4_ = fVar186 * auVar9._4_4_;
  auVar245._8_4_ = fVar187 * auVar9._8_4_;
  auVar245._12_4_ = fVar188 * auVar9._12_4_;
  auVar235._0_4_ = fVar173 * auVar11._0_4_;
  auVar235._4_4_ = fVar186 * auVar11._4_4_;
  auVar235._8_4_ = fVar187 * auVar11._8_4_;
  auVar235._12_4_ = fVar188 * auVar11._12_4_;
  auVar113._0_4_ = fVar60 * auVar9._0_4_;
  auVar113._4_4_ = fVar62 * auVar9._4_4_;
  auVar113._8_4_ = fVar140 * auVar9._8_4_;
  auVar113._12_4_ = fVar210 * auVar9._12_4_;
  auVar153._0_4_ = fVar60 * auVar11._0_4_;
  auVar153._4_4_ = fVar62 * auVar11._4_4_;
  auVar153._8_4_ = fVar140 * auVar11._8_4_;
  auVar153._12_4_ = fVar210 * auVar11._12_4_;
  auVar9 = vminps_avx(auVar245,auVar235);
  auVar11 = vminps_avx(auVar113,auVar153);
  auVar9 = vminps_avx(auVar9,auVar11);
  auVar11 = vmaxps_avx(auVar235,auVar245);
  auVar107 = vmaxps_avx(auVar153,auVar113);
  auVar226 = vminps_avx(auVar254,auVar205);
  auVar64 = vminps_avx(auVar100,auVar220);
  auVar226 = vminps_avx(auVar226,auVar64);
  auVar9 = vhaddps_avx(auVar9,auVar226);
  auVar11 = vmaxps_avx(auVar107,auVar11);
  auVar107 = vmaxps_avx(auVar205,auVar254);
  auVar226 = vmaxps_avx(auVar220,auVar100);
  auVar107 = vmaxps_avx(auVar226,auVar107);
  auVar11 = vhaddps_avx(auVar11,auVar107);
  auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
  auVar11 = vshufps_avx(auVar11,auVar11,0xe8);
  auVar221._0_4_ = auVar63._0_4_ + auVar9._0_4_;
  auVar221._4_4_ = auVar63._4_4_ + auVar9._4_4_;
  auVar221._8_4_ = auVar63._8_4_ + auVar9._8_4_;
  auVar221._12_4_ = auVar63._12_4_ + auVar9._12_4_;
  auVar206._0_4_ = auVar63._0_4_ + auVar11._0_4_;
  auVar206._4_4_ = auVar63._4_4_ + auVar11._4_4_;
  auVar206._8_4_ = auVar63._8_4_ + auVar11._8_4_;
  auVar206._12_4_ = auVar63._12_4_ + auVar11._12_4_;
  auVar209 = ZEXT1664(auVar206);
  auVar9 = vmaxps_avx(auVar232,auVar221);
  auVar11 = vminps_avx(auVar206,auVar65);
  auVar9 = vcmpps_avx(auVar11,auVar9,1);
  auVar9 = vshufps_avx(auVar9,auVar9,0x50);
  if ((auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar9[0xf] < '\0')
  goto LAB_015a6180;
  bVar53 = 0;
  if ((auVar185._0_4_ < auVar221._0_4_) && (bVar53 = 0, auVar206._0_4_ < auVar65._0_4_)) {
    auVar11 = vmovshdup_avx(auVar221);
    auVar9 = vcmpps_avx(auVar206,auVar65,1);
    bVar53 = auVar9[4] & auVar94._0_4_ < auVar11._0_4_;
  }
  if (((3 < uVar50 || fVar59 < 0.001) | bVar53) == 1) {
    lVar52 = 200;
    auVar209 = ZEXT1664(local_488);
    do {
      fVar62 = auVar63._0_4_;
      fVar60 = 1.0 - fVar62;
      fVar59 = fVar60 * fVar60 * fVar60;
      fVar91 = fVar62 * 3.0 * fVar60 * fVar60;
      fVar60 = fVar60 * fVar62 * fVar62 * 3.0;
      auVar135._4_4_ = fVar59;
      auVar135._0_4_ = fVar59;
      auVar135._8_4_ = fVar59;
      auVar135._12_4_ = fVar59;
      auVar114._4_4_ = fVar91;
      auVar114._0_4_ = fVar91;
      auVar114._8_4_ = fVar91;
      auVar114._12_4_ = fVar91;
      auVar101._4_4_ = fVar60;
      auVar101._0_4_ = fVar60;
      auVar101._8_4_ = fVar60;
      auVar101._12_4_ = fVar60;
      fVar62 = fVar62 * fVar62 * fVar62;
      auVar154._0_4_ = (float)local_238._0_4_ * fVar62;
      auVar154._4_4_ = (float)local_238._4_4_ * fVar62;
      auVar154._8_4_ = fStack_230 * fVar62;
      auVar154._12_4_ = fStack_22c * fVar62;
      auVar12 = vfmadd231ps_fma(auVar154,local_4f8,auVar101);
      auVar12 = vfmadd231ps_fma(auVar12,local_4e8,auVar114);
      auVar12 = vfmadd231ps_fma(auVar12,local_488,auVar135);
      auVar102._8_8_ = auVar12._0_8_;
      auVar102._0_8_ = auVar12._0_8_;
      auVar12 = vshufpd_avx(auVar12,auVar12,3);
      auVar9 = vshufps_avx(auVar63,auVar63,0x55);
      auVar12 = vsubps_avx(auVar12,auVar102);
      auVar9 = vfmadd213ps_fma(auVar12,auVar9,auVar102);
      fVar59 = auVar9._0_4_;
      auVar12 = vshufps_avx(auVar9,auVar9,0x55);
      auVar103._0_4_ = fVar117 * fVar59 + fVar92 * auVar12._0_4_;
      auVar103._4_4_ = auVar258._4_4_ * fVar59 + auVar10._4_4_ * auVar12._4_4_;
      auVar103._8_4_ = auVar258._8_4_ * fVar59 + auVar10._8_4_ * auVar12._8_4_;
      auVar103._12_4_ = auVar258._12_4_ * fVar59 + auVar10._12_4_ * auVar12._12_4_;
      auVar63 = vsubps_avx(auVar63,auVar103);
      auVar12 = vandps_avx(local_3f8,auVar9);
      auVar9 = vshufps_avx(auVar12,auVar12,0xf5);
      auVar12 = vmaxss_avx(auVar9,auVar12);
      if (auVar12._0_4_ < (float)local_4d8._0_4_) {
        fVar59 = auVar63._0_4_;
        if ((0.0 <= fVar59) && (fVar59 <= 1.0)) {
          auVar12 = vmovshdup_avx(auVar63);
          fVar91 = auVar12._0_4_;
          if ((0.0 <= fVar91) && (fVar91 <= 1.0)) {
            auVar12 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                    ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
            auVar107 = vinsertps_avx(auVar12,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28
                                    );
            aVar1 = (ray->org).field_0;
            auVar12 = vsubps_avx(local_418,(undefined1  [16])aVar1);
            auVar12 = vdpps_avx(auVar12,auVar107,0x7f);
            auVar9 = vsubps_avx(local_448,(undefined1  [16])aVar1);
            auVar9 = vdpps_avx(auVar9,auVar107,0x7f);
            auVar258 = vsubps_avx(local_458,(undefined1  [16])aVar1);
            auVar258 = vdpps_avx(auVar258,auVar107,0x7f);
            auVar10 = vsubps_avx(local_438,(undefined1  [16])aVar1);
            auVar10 = vdpps_avx(auVar10,auVar107,0x7f);
            auVar11 = vsubps_avx(_local_428,(undefined1  [16])aVar1);
            auVar11 = vdpps_avx(auVar11,auVar107,0x7f);
            auVar232 = vsubps_avx(_local_468,(undefined1  [16])aVar1);
            auVar232 = vdpps_avx(auVar232,auVar107,0x7f);
            auVar65 = vsubps_avx(_local_478,(undefined1  [16])aVar1);
            auVar65 = vdpps_avx(auVar65,auVar107,0x7f);
            auVar45._4_4_ = fStack_4b4;
            auVar45._0_4_ = local_4b8;
            auVar45._8_4_ = fStack_4b0;
            auVar45._12_4_ = fStack_4ac;
            auVar226 = vsubps_avx(auVar45,(undefined1  [16])aVar1);
            auVar107 = vdpps_avx(auVar226,auVar107,0x7f);
            fVar117 = 1.0 - fVar91;
            auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar91)),ZEXT416((uint)fVar117)
                                      ,auVar12);
            auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar232._0_4_ * fVar91)),ZEXT416((uint)fVar117)
                                     ,auVar9);
            auVar258 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * fVar91)),
                                       ZEXT416((uint)fVar117),auVar258);
            auVar209 = ZEXT1664(auVar258);
            auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar91 * auVar107._0_4_)),
                                      ZEXT416((uint)fVar117),auVar10);
            fVar60 = 1.0 - fVar59;
            fVar91 = fVar60 * fVar59 * fVar59 * 3.0;
            fVar140 = fVar59 * fVar59 * fVar59;
            auVar258 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar140)),
                                       ZEXT416((uint)fVar91),auVar258);
            fVar117 = fVar59 * 3.0 * fVar60 * fVar60;
            auVar9 = vfmadd231ss_fma(auVar258,ZEXT416((uint)fVar117),auVar9);
            fVar92 = fVar60 * fVar60 * fVar60;
            auVar12 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar92),auVar12);
            fVar62 = auVar12._0_4_;
            if (((ray->org).field_0.m128[3] <= fVar62) && (fVar62 <= ray->tfar)) {
              pGVar4 = (context->scene->geometries).items[local_4c0].ptr;
              if ((pGVar4->mask & ray->mask) == 0) {
                bVar53 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar53 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_518._0_4_ = ray->tfar;
                auVar12 = vshufps_avx(auVar63,auVar63,0x55);
                auVar194._8_4_ = 0x3f800000;
                auVar194._0_8_ = 0x3f8000003f800000;
                auVar194._12_4_ = 0x3f800000;
                auVar9 = vsubps_avx(auVar194,auVar12);
                fVar210 = auVar12._0_4_;
                auVar207._0_4_ = fVar210 * (float)local_428._0_4_;
                fVar173 = auVar12._4_4_;
                auVar207._4_4_ = fVar173 * (float)local_428._4_4_;
                fVar186 = auVar12._8_4_;
                auVar207._8_4_ = fVar186 * fStack_420;
                fVar187 = auVar12._12_4_;
                auVar207._12_4_ = fVar187 * fStack_41c;
                auVar222._0_4_ = fVar210 * (float)local_468._0_4_;
                auVar222._4_4_ = fVar173 * (float)local_468._4_4_;
                auVar222._8_4_ = fVar186 * fStack_460;
                auVar222._12_4_ = fVar187 * fStack_45c;
                auVar229._0_4_ = fVar210 * (float)local_478._0_4_;
                auVar229._4_4_ = fVar173 * (float)local_478._4_4_;
                auVar229._8_4_ = fVar186 * fStack_470;
                auVar229._12_4_ = fVar187 * fStack_46c;
                auVar180._0_4_ = fVar210 * local_4b8;
                auVar180._4_4_ = fVar173 * fStack_4b4;
                auVar180._8_4_ = fVar186 * fStack_4b0;
                auVar180._12_4_ = fVar187 * fStack_4ac;
                auVar12 = vfmadd231ps_fma(auVar207,auVar9,local_418);
                auVar258 = vfmadd231ps_fma(auVar222,auVar9,local_448);
                auVar10 = vfmadd231ps_fma(auVar229,auVar9,local_458);
                auVar11 = vfmadd231ps_fma(auVar180,auVar9,local_438);
                auVar12 = vsubps_avx(auVar258,auVar12);
                auVar9 = vsubps_avx(auVar10,auVar258);
                auVar209 = ZEXT1664(auVar9);
                auVar258 = vsubps_avx(auVar11,auVar10);
                auVar230._0_4_ = fVar59 * auVar9._0_4_;
                auVar230._4_4_ = fVar59 * auVar9._4_4_;
                auVar230._8_4_ = fVar59 * auVar9._8_4_;
                auVar230._12_4_ = fVar59 * auVar9._12_4_;
                auVar171._4_4_ = fVar60;
                auVar171._0_4_ = fVar60;
                auVar171._8_4_ = fVar60;
                auVar171._12_4_ = fVar60;
                auVar12 = vfmadd231ps_fma(auVar230,auVar171,auVar12);
                auVar181._0_4_ = fVar59 * auVar258._0_4_;
                auVar181._4_4_ = fVar59 * auVar258._4_4_;
                auVar181._8_4_ = fVar59 * auVar258._8_4_;
                auVar181._12_4_ = fVar59 * auVar258._12_4_;
                auVar258 = vfmadd231ps_fma(auVar181,auVar171,auVar9);
                auVar182._0_4_ = fVar59 * auVar258._0_4_;
                auVar182._4_4_ = fVar59 * auVar258._4_4_;
                auVar182._8_4_ = fVar59 * auVar258._8_4_;
                auVar182._12_4_ = fVar59 * auVar258._12_4_;
                auVar258 = vfmadd231ps_fma(auVar182,auVar171,auVar12);
                auVar155._0_4_ = fVar140 * (float)local_298._0_4_;
                auVar155._4_4_ = fVar140 * (float)local_298._4_4_;
                auVar155._8_4_ = fVar140 * fStack_290;
                auVar155._12_4_ = fVar140 * fStack_28c;
                auVar115._4_4_ = fVar91;
                auVar115._0_4_ = fVar91;
                auVar115._8_4_ = fVar91;
                auVar115._12_4_ = fVar91;
                auVar12 = vfmadd132ps_fma(auVar115,auVar155,local_288);
                auVar136._4_4_ = fVar117;
                auVar136._0_4_ = fVar117;
                auVar136._8_4_ = fVar117;
                auVar136._12_4_ = fVar117;
                auVar12 = vfmadd132ps_fma(auVar136,auVar12,local_278);
                auVar116._0_4_ = auVar258._0_4_ * 3.0;
                auVar116._4_4_ = auVar258._4_4_ * 3.0;
                auVar116._8_4_ = auVar258._8_4_ * 3.0;
                auVar116._12_4_ = auVar258._12_4_ * 3.0;
                auVar125._4_4_ = fVar92;
                auVar125._0_4_ = fVar92;
                auVar125._8_4_ = fVar92;
                auVar125._12_4_ = fVar92;
                auVar258 = vfmadd132ps_fma(auVar125,auVar12,local_268);
                auVar12 = vshufps_avx(auVar116,auVar116,0xc9);
                auVar137._0_4_ = auVar258._0_4_ * auVar12._0_4_;
                auVar137._4_4_ = auVar258._4_4_ * auVar12._4_4_;
                auVar137._8_4_ = auVar258._8_4_ * auVar12._8_4_;
                auVar137._12_4_ = auVar258._12_4_ * auVar12._12_4_;
                auVar12 = vshufps_avx(auVar258,auVar258,0xc9);
                auVar258 = vfmsub231ps_fma(auVar137,auVar116,auVar12);
                auVar12 = vshufps_avx(auVar258,auVar258,0xe9);
                local_2c8 = vmovlps_avx(auVar12);
                local_2c0 = auVar258._0_4_;
                local_2bc = vmovlps_avx(auVar63);
                local_2b4 = (int)local_370;
                local_2b0 = (int)local_4c0;
                local_2ac = context->user->instID[0];
                local_2a8 = context->user->instPrimID[0];
                ray->tfar = fVar62;
                local_51c = -1;
                local_348.valid = &local_51c;
                local_348.geometryUserPtr = pGVar4->userPtr;
                local_348.context = context->user;
                local_348.hit = (RTCHitN *)&local_2c8;
                local_348.N = 1;
                local_348.ray = (RTCRayN *)ray;
                if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015a6e87:
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar209 = ZEXT1664(auVar209._0_16_);
                    (*p_Var5)(&local_348);
                    if (*local_348.valid == 0) goto LAB_015a6ed9;
                  }
                  bVar53 = 1;
                }
                else {
                  auVar209 = ZEXT1664(auVar9);
                  (*pGVar4->occlusionFilterN)(&local_348);
                  if (*local_348.valid != 0) goto LAB_015a6e87;
LAB_015a6ed9:
                  ray->tfar = (float)local_518._0_4_;
                  bVar53 = 0;
                }
              }
              bVar56 = (bool)(bVar56 | bVar53);
            }
          }
        }
        break;
      }
      lVar52 = lVar52 + -1;
    } while (lVar52 != 0);
    goto LAB_015a6180;
  }
  local_248 = vinsertps_avx(auVar12,ZEXT416((uint)fVar91),0x10);
  auVar76 = vinsertps_avx(auVar94,ZEXT416((uint)auVar128._0_4_),0x10);
  goto LAB_015a5c06;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }